

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  uint uVar6;
  Scene *pSVar7;
  Ref<embree::Geometry> *pRVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  byte bVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  AABBNodeMB4D *node1;
  ulong uVar69;
  long lVar70;
  int iVar71;
  uint uVar72;
  undefined1 (*pauVar73) [16];
  long lVar74;
  ulong uVar75;
  ulong uVar76;
  long lVar77;
  ulong uVar78;
  uint uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  long lVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  RTCIntersectArguments *pRVar91;
  ulong uVar92;
  undefined1 auVar93 [16];
  float fVar97;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar96 [64];
  float fVar101;
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar105 [32];
  undefined1 auVar104 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar113;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar111;
  float fVar112;
  float fVar114;
  float fVar115;
  undefined1 auVar110 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar123;
  float fVar136;
  float fVar137;
  undefined1 auVar124 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar130 [32];
  float fVar138;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar127 [16];
  undefined1 auVar134 [32];
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar135 [64];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar152;
  float fVar153;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar158 [64];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar182 [32];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar183 [64];
  float fVar202;
  float fVar203;
  undefined1 auVar204 [32];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar205 [64];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  float fVar215;
  undefined1 auVar216 [32];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar217 [64];
  float fVar224;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar227 [64];
  float fVar234;
  undefined1 auVar235 [32];
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar236 [64];
  float fVar243;
  undefined1 auVar244 [16];
  float fVar249;
  undefined1 auVar245 [32];
  float fVar247;
  float fVar248;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar246 [64];
  float fVar253;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar254 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2a24;
  undefined1 local_2a20 [8];
  float fStack_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  float fStack_2a08;
  float fStack_2a04;
  undefined8 local_2a00;
  float fStack_29f8;
  float fStack_29f4;
  float fStack_29f0;
  float fStack_29ec;
  float fStack_29e8;
  float fStack_29e4;
  float local_29e0;
  float fStack_29dc;
  float fStack_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  float fStack_29c4;
  undefined1 local_29c0 [8];
  float fStack_29b8;
  float fStack_29b4;
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  float fStack_29a4;
  undefined1 local_29a0 [8];
  float fStack_2998;
  float fStack_2994;
  undefined1 local_2990 [8];
  float fStack_2988;
  float fStack_2984;
  ulong local_2980;
  undefined1 (*local_2978) [16];
  long local_2970;
  ulong local_2968;
  ulong local_2960;
  long local_2958;
  ulong local_2950;
  long local_2948;
  RTCFilterFunctionNArguments local_2940;
  float local_2910;
  float local_290c;
  float local_2908;
  undefined4 local_2904;
  undefined4 local_2900;
  undefined4 local_28fc;
  uint local_28f8;
  uint local_28f4;
  uint local_28f0;
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [8];
  float fStack_2858;
  float fStack_2854;
  undefined1 auStack_2850 [16];
  undefined1 local_2840 [8];
  float fStack_2838;
  float fStack_2834;
  undefined1 local_2820 [8];
  float fStack_2818;
  float fStack_2814;
  undefined4 uStack_2804;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  undefined4 uStack_27c4;
  undefined1 local_27c0 [8];
  float fStack_27b8;
  float fStack_27b4;
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [8];
  float fStack_2738;
  float fStack_2734;
  undefined1 local_2730 [8];
  float fStack_2728;
  float fStack_2724;
  undefined1 local_2720 [8];
  float fStack_2718;
  float fStack_2714;
  undefined1 local_2710 [8];
  float fStack_2708;
  float fStack_2704;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined1 local_26e0 [8];
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float fStack_26c4;
  float local_26c0;
  float fStack_26bc;
  float fStack_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  float fStack_26a4;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  undefined4 uStack_2544;
  undefined1 local_2540 [32];
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  undefined1 auVar151 [64];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2978 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar5 = (ray->super_RayK<1>).dir.field_0;
    auVar103 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
    fVar3 = (ray->super_RayK<1>).tfar;
    auVar110 = ZEXT464((uint)fVar3);
    auVar125._8_4_ = 0x7fffffff;
    auVar125._0_8_ = 0x7fffffff7fffffff;
    auVar125._12_4_ = 0x7fffffff;
    auVar125 = vandps_avx((undefined1  [16])aVar5,auVar125);
    auVar127._8_4_ = 0x219392ef;
    auVar127._0_8_ = 0x219392ef219392ef;
    auVar127._12_4_ = 0x219392ef;
    auVar125 = vcmpps_avx(auVar125,auVar127,1);
    auVar142._8_4_ = 0x3f800000;
    auVar142._0_8_ = 0x3f8000003f800000;
    auVar142._12_4_ = 0x3f800000;
    auVar127 = vdivps_avx(auVar142,(undefined1  [16])aVar5);
    auVar143._8_4_ = 0x5d5e0b6b;
    auVar143._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar143._12_4_ = 0x5d5e0b6b;
    auVar125 = vblendvps_avx(auVar127,auVar143,auVar125);
    auVar127 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar3));
    auVar144._0_4_ = auVar125._0_4_ * 0.99999964;
    auVar144._4_4_ = auVar125._4_4_ * 0.99999964;
    auVar144._8_4_ = auVar125._8_4_ * 0.99999964;
    auVar144._12_4_ = auVar125._12_4_ * 0.99999964;
    uVar4 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23e0._4_4_ = uVar4;
    local_23e0._0_4_ = uVar4;
    local_23e0._8_4_ = uVar4;
    local_23e0._12_4_ = uVar4;
    local_23e0._16_4_ = uVar4;
    local_23e0._20_4_ = uVar4;
    local_23e0._24_4_ = uVar4;
    local_23e0._28_4_ = uVar4;
    auVar183 = ZEXT3264(local_23e0);
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2400._4_4_ = uVar4;
    local_2400._0_4_ = uVar4;
    local_2400._8_4_ = uVar4;
    local_2400._12_4_ = uVar4;
    local_2400._16_4_ = uVar4;
    local_2400._20_4_ = uVar4;
    local_2400._24_4_ = uVar4;
    local_2400._28_4_ = uVar4;
    auVar205 = ZEXT3264(local_2400);
    auVar124._0_4_ = auVar125._0_4_ * 1.0000004;
    auVar124._4_4_ = auVar125._4_4_ * 1.0000004;
    auVar124._8_4_ = auVar125._8_4_ * 1.0000004;
    auVar124._12_4_ = auVar125._12_4_ * 1.0000004;
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2420._4_4_ = uVar4;
    local_2420._0_4_ = uVar4;
    local_2420._8_4_ = uVar4;
    local_2420._12_4_ = uVar4;
    local_2420._16_4_ = uVar4;
    local_2420._20_4_ = uVar4;
    local_2420._24_4_ = uVar4;
    local_2420._28_4_ = uVar4;
    auVar214 = ZEXT3264(local_2420);
    auVar125 = vshufps_avx(auVar144,auVar144,0);
    local_2440._16_16_ = auVar125;
    local_2440._0_16_ = auVar125;
    auVar217 = ZEXT3264(local_2440);
    auVar125 = vmovshdup_avx(auVar144);
    auVar158 = ZEXT1664(auVar125);
    auVar142 = vshufps_avx(auVar144,auVar144,0x55);
    local_2460._16_16_ = auVar142;
    local_2460._0_16_ = auVar142;
    auVar227 = ZEXT3264(local_2460);
    auVar142 = vshufpd_avx(auVar144,auVar144,1);
    auVar143 = vshufps_avx(auVar144,auVar144,0xaa);
    local_2480._16_16_ = auVar143;
    local_2480._0_16_ = auVar143;
    auVar236 = ZEXT3264(local_2480);
    auVar143 = vshufps_avx(auVar124,auVar124,0);
    local_24a0._16_16_ = auVar143;
    local_24a0._0_16_ = auVar143;
    auVar246 = ZEXT3264(local_24a0);
    auVar143 = vshufps_avx(auVar124,auVar124,0x55);
    local_24c0._16_16_ = auVar143;
    local_24c0._0_16_ = auVar143;
    auVar254 = ZEXT3264(local_24c0);
    auVar143 = vshufps_avx(auVar124,auVar124,0xaa);
    uVar78 = (ulong)(auVar144._0_4_ < 0.0) << 5;
    local_24e0._16_16_ = auVar143;
    local_24e0._0_16_ = auVar143;
    uVar76 = (ulong)(auVar125._0_4_ < 0.0) << 5 | 0x40;
    auVar178 = ZEXT3264(local_24e0);
    uVar85 = (ulong)(auVar142._0_4_ < 0.0) << 5 | 0x80;
    uVar92 = uVar78 ^ 0x20;
    auVar125 = vshufps_avx(auVar103,auVar103,0);
    local_28a0._16_16_ = auVar125;
    local_28a0._0_16_ = auVar125;
    auVar174 = ZEXT3264(local_28a0);
    auVar125 = vshufps_avx(auVar127,auVar127,0);
    auVar96 = ZEXT3264(CONCAT1616(auVar125,auVar125));
    local_2500._16_16_ = mm_lookupmask_ps._240_16_;
    local_2500._0_16_ = mm_lookupmask_ps._0_16_;
    auVar135 = ZEXT3264(local_2500);
    auVar146._8_4_ = 0x3f800000;
    auVar146._0_8_ = 0x3f8000003f800000;
    auVar146._12_4_ = 0x3f800000;
    auVar146._16_4_ = 0x3f800000;
    auVar146._20_4_ = 0x3f800000;
    auVar146._24_4_ = 0x3f800000;
    auVar146._28_4_ = 0x3f800000;
    auVar151 = ZEXT3264(auVar146);
    auVar118._8_4_ = 0xbf800000;
    auVar118._0_8_ = 0xbf800000bf800000;
    auVar118._12_4_ = 0xbf800000;
    auVar118._16_4_ = 0xbf800000;
    auVar118._20_4_ = 0xbf800000;
    auVar118._24_4_ = 0xbf800000;
    auVar118._28_4_ = 0xbf800000;
    _local_2520 = vblendvps_avx(auVar146,auVar118,local_2500);
    local_2980 = uVar78;
LAB_00e6f451:
    if (local_2978 != (undefined1 (*) [16])&local_23a0) {
      pauVar73 = local_2978 + -1;
      local_2978 = local_2978 + -1;
      if (*(float *)(*pauVar73 + 8) <= auVar110._0_4_) {
        uVar75 = *(ulong *)*local_2978;
        while ((uVar75 & 8) == 0) {
          uVar69 = uVar75 & 0xfffffffffffffff0;
          fVar3 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar119._4_4_ = fVar3;
          auVar119._0_4_ = fVar3;
          auVar119._8_4_ = fVar3;
          auVar119._12_4_ = fVar3;
          auVar119._16_4_ = fVar3;
          auVar119._20_4_ = fVar3;
          auVar119._24_4_ = fVar3;
          auVar119._28_4_ = fVar3;
          pfVar2 = (float *)(uVar69 + 0x100 + uVar78);
          pfVar1 = (float *)(uVar69 + 0x40 + uVar78);
          auVar105._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar105._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar105._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar105._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar105._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar105._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar105._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar105._28_4_ = auVar110._28_4_ + pfVar1[7];
          auVar118 = vsubps_avx(auVar105,auVar183._0_32_);
          auVar15._4_4_ = auVar217._4_4_ * auVar118._4_4_;
          auVar15._0_4_ = auVar217._0_4_ * auVar118._0_4_;
          auVar15._8_4_ = auVar217._8_4_ * auVar118._8_4_;
          auVar15._12_4_ = auVar217._12_4_ * auVar118._12_4_;
          auVar15._16_4_ = auVar217._16_4_ * auVar118._16_4_;
          auVar15._20_4_ = auVar217._20_4_ * auVar118._20_4_;
          auVar15._24_4_ = auVar217._24_4_ * auVar118._24_4_;
          auVar15._28_4_ = auVar118._28_4_;
          auVar118 = vmaxps_avx(auVar174._0_32_,auVar15);
          pfVar2 = (float *)(uVar69 + 0x100 + uVar76);
          pfVar1 = (float *)(uVar69 + 0x40 + uVar76);
          auVar128._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar128._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar128._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar128._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar128._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar128._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar128._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar128._28_4_ = auVar135._28_4_ + pfVar1[7];
          auVar146 = vsubps_avx(auVar128,auVar205._0_32_);
          auVar16._4_4_ = auVar227._4_4_ * auVar146._4_4_;
          auVar16._0_4_ = auVar227._0_4_ * auVar146._0_4_;
          auVar16._8_4_ = auVar227._8_4_ * auVar146._8_4_;
          auVar16._12_4_ = auVar227._12_4_ * auVar146._12_4_;
          auVar16._16_4_ = auVar227._16_4_ * auVar146._16_4_;
          auVar16._20_4_ = auVar227._20_4_ * auVar146._20_4_;
          auVar16._24_4_ = auVar227._24_4_ * auVar146._24_4_;
          auVar16._28_4_ = auVar146._28_4_;
          pfVar2 = (float *)(uVar69 + 0x100 + uVar85);
          pfVar1 = (float *)(uVar69 + 0x40 + uVar85);
          auVar147._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar147._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar147._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar147._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar147._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar147._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar147._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar147._28_4_ = auVar151._28_4_ + pfVar1[7];
          auVar15 = vsubps_avx(auVar147,auVar214._0_32_);
          auVar17._4_4_ = auVar236._4_4_ * auVar15._4_4_;
          auVar17._0_4_ = auVar236._0_4_ * auVar15._0_4_;
          auVar17._8_4_ = auVar236._8_4_ * auVar15._8_4_;
          auVar17._12_4_ = auVar236._12_4_ * auVar15._12_4_;
          auVar17._16_4_ = auVar236._16_4_ * auVar15._16_4_;
          auVar17._20_4_ = auVar236._20_4_ * auVar15._20_4_;
          auVar17._24_4_ = auVar236._24_4_ * auVar15._24_4_;
          auVar17._28_4_ = auVar15._28_4_;
          auVar146 = vmaxps_avx(auVar16,auVar17);
          _local_26e0 = vmaxps_avx(auVar118,auVar146);
          pfVar2 = (float *)(uVar69 + 0x100 + uVar92);
          pfVar1 = (float *)(uVar69 + 0x40 + uVar92);
          auVar129._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar129._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar129._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar129._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar129._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar129._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar129._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar129._28_4_ = auVar146._28_4_ + pfVar1[7];
          auVar118 = vsubps_avx(auVar129,auVar183._0_32_);
          auVar18._4_4_ = auVar246._4_4_ * auVar118._4_4_;
          auVar18._0_4_ = auVar246._0_4_ * auVar118._0_4_;
          auVar18._8_4_ = auVar246._8_4_ * auVar118._8_4_;
          auVar18._12_4_ = auVar246._12_4_ * auVar118._12_4_;
          auVar18._16_4_ = auVar246._16_4_ * auVar118._16_4_;
          auVar18._20_4_ = auVar246._20_4_ * auVar118._20_4_;
          auVar18._24_4_ = auVar246._24_4_ * auVar118._24_4_;
          auVar18._28_4_ = auVar118._28_4_;
          pfVar2 = (float *)(uVar69 + 0x100 + (uVar76 ^ 0x20));
          auVar118 = vminps_avx(auVar96._0_32_,auVar18);
          pfVar1 = (float *)(uVar69 + 0x40 + (uVar76 ^ 0x20));
          auVar148._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar148._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar148._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar148._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar148._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar148._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar148._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar148._28_4_ = auVar15._28_4_ + pfVar1[7];
          auVar146 = vsubps_avx(auVar148,auVar205._0_32_);
          pfVar2 = (float *)(uVar69 + 0x100 + (uVar85 ^ 0x20));
          pfVar1 = (float *)(uVar69 + 0x40 + (uVar85 ^ 0x20));
          auVar156._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar156._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar156._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar156._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar156._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar156._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar156._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar156._28_4_ = auVar158._28_4_ + pfVar1[7];
          auVar19._4_4_ = auVar254._4_4_ * auVar146._4_4_;
          auVar19._0_4_ = auVar254._0_4_ * auVar146._0_4_;
          auVar19._8_4_ = auVar254._8_4_ * auVar146._8_4_;
          auVar19._12_4_ = auVar254._12_4_ * auVar146._12_4_;
          auVar19._16_4_ = auVar254._16_4_ * auVar146._16_4_;
          auVar19._20_4_ = auVar254._20_4_ * auVar146._20_4_;
          auVar19._24_4_ = auVar254._24_4_ * auVar146._24_4_;
          auVar19._28_4_ = auVar146._28_4_;
          auVar146 = vsubps_avx(auVar156,auVar214._0_32_);
          auVar20._4_4_ = auVar178._4_4_ * auVar146._4_4_;
          auVar20._0_4_ = auVar178._0_4_ * auVar146._0_4_;
          auVar20._8_4_ = auVar178._8_4_ * auVar146._8_4_;
          auVar20._12_4_ = auVar178._12_4_ * auVar146._12_4_;
          auVar20._16_4_ = auVar178._16_4_ * auVar146._16_4_;
          auVar20._20_4_ = auVar178._20_4_ * auVar146._20_4_;
          auVar20._24_4_ = auVar178._24_4_ * auVar146._24_4_;
          auVar20._28_4_ = auVar146._28_4_;
          auVar158 = ZEXT3264(auVar20);
          auVar146 = vminps_avx(auVar19,auVar20);
          auVar118 = vminps_avx(auVar118,auVar146);
          auVar118 = vcmpps_avx(_local_26e0,auVar118,2);
          if (((uint)uVar75 & 7) == 6) {
            auVar146 = vcmpps_avx(*(undefined1 (*) [32])(uVar69 + 0x1c0),auVar119,2);
            auVar15 = vcmpps_avx(auVar119,*(undefined1 (*) [32])(uVar69 + 0x1e0),1);
            auVar15 = vandps_avx(auVar146,auVar15);
            auVar118 = vandps_avx(auVar15,auVar118);
            auVar125 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
          }
          else {
            auVar125 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
          }
          auVar151 = ZEXT3264(auVar146);
          auVar125 = vpsllw_avx(auVar125,0xf);
          auVar135 = ZEXT1664(auVar125);
          if ((((((((auVar125 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar125 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar125 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar125 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar125 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar125 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar125 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar125[0xf]) {
            auVar125 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                              ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar110 = ZEXT1664(auVar125);
            goto LAB_00e6f451;
          }
          auVar125 = vpacksswb_avx(auVar125,auVar125);
          auVar110 = ZEXT1664(auVar125);
          bVar26 = SUB161(auVar125 >> 7,0) & 1 | (SUB161(auVar125 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar125 >> 0x17,0) & 1) << 2 | (SUB161(auVar125 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar125 >> 0x27,0) & 1) << 4 | (SUB161(auVar125 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar125 >> 0x37,0) & 1) << 6 | SUB161(auVar125 >> 0x3f,0) << 7;
          lVar70 = 0;
          if (bVar26 != 0) {
            for (; (bVar26 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
            }
          }
          uVar75 = *(ulong *)(uVar69 + lVar70 * 8);
          uVar79 = bVar26 - 1 & (uint)bVar26;
          if (uVar79 != 0) {
            uVar72 = *(uint *)(local_26e0 + lVar70 * 4);
            lVar70 = 0;
            if (uVar79 != 0) {
              for (; (uVar79 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
              }
            }
            uVar80 = *(ulong *)(uVar69 + lVar70 * 8);
            uVar6 = *(uint *)(local_26e0 + lVar70 * 4);
            uVar79 = uVar79 - 1 & uVar79;
            if (uVar79 == 0) {
              if (uVar72 < uVar6) {
                *(ulong *)*local_2978 = uVar80;
                *(uint *)(*local_2978 + 8) = uVar6;
                local_2978 = local_2978 + 1;
              }
              else {
                *(ulong *)*local_2978 = uVar75;
                *(uint *)(*local_2978 + 8) = uVar72;
                local_2978 = local_2978 + 1;
                uVar75 = uVar80;
              }
            }
            else {
              auVar103._8_8_ = 0;
              auVar103._0_8_ = uVar75;
              auVar125 = vpunpcklqdq_avx(auVar103,ZEXT416(uVar72));
              auVar116._8_8_ = 0;
              auVar116._0_8_ = uVar80;
              auVar127 = vpunpcklqdq_avx(auVar116,ZEXT416(uVar6));
              lVar70 = 0;
              if (uVar79 != 0) {
                for (; (uVar79 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
                }
              }
              auVar126._8_8_ = 0;
              auVar126._0_8_ = *(ulong *)(uVar69 + lVar70 * 8);
              auVar103 = vpunpcklqdq_avx(auVar126,ZEXT416(*(uint *)(local_26e0 + lVar70 * 4)));
              auVar142 = vpcmpgtd_avx(auVar127,auVar125);
              uVar79 = uVar79 - 1 & uVar79;
              if (uVar79 == 0) {
                auVar143 = vpshufd_avx(auVar142,0xaa);
                auVar142 = vblendvps_avx(auVar127,auVar125,auVar143);
                auVar125 = vblendvps_avx(auVar125,auVar127,auVar143);
                auVar127 = vpcmpgtd_avx(auVar103,auVar142);
                auVar143 = vpshufd_avx(auVar127,0xaa);
                auVar127 = vblendvps_avx(auVar103,auVar142,auVar143);
                auVar151 = ZEXT1664(auVar127);
                auVar103 = vblendvps_avx(auVar142,auVar103,auVar143);
                auVar142 = vpcmpgtd_avx(auVar103,auVar125);
                auVar143 = vpshufd_avx(auVar142,0xaa);
                auVar135 = ZEXT1664(auVar143);
                auVar142 = vblendvps_avx(auVar103,auVar125,auVar143);
                auVar158 = ZEXT1664(auVar142);
                auVar125 = vblendvps_avx(auVar125,auVar103,auVar143);
                auVar110 = ZEXT1664(auVar125);
                *local_2978 = auVar125;
                local_2978[1] = auVar142;
                uVar75 = auVar127._0_8_;
                local_2978 = local_2978 + 2;
              }
              else {
                lVar70 = 0;
                if (uVar79 != 0) {
                  for (; (uVar79 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
                  }
                }
                auVar154._8_8_ = 0;
                auVar154._0_8_ = *(ulong *)(uVar69 + lVar70 * 8);
                auVar143 = vpunpcklqdq_avx(auVar154,ZEXT416(*(uint *)(local_26e0 + lVar70 * 4)));
                uVar79 = uVar79 - 1 & uVar79;
                uVar75 = (ulong)uVar79;
                if (uVar79 == 0) {
                  auVar124 = vpshufd_avx(auVar142,0xaa);
                  auVar142 = vblendvps_avx(auVar127,auVar125,auVar124);
                  auVar125 = vblendvps_avx(auVar125,auVar127,auVar124);
                  auVar127 = vpcmpgtd_avx(auVar143,auVar103);
                  auVar124 = vpshufd_avx(auVar127,0xaa);
                  auVar127 = vblendvps_avx(auVar143,auVar103,auVar124);
                  auVar103 = vblendvps_avx(auVar103,auVar143,auVar124);
                  auVar143 = vpcmpgtd_avx(auVar103,auVar125);
                  auVar124 = vpshufd_avx(auVar143,0xaa);
                  auVar143 = vblendvps_avx(auVar103,auVar125,auVar124);
                  auVar125 = vblendvps_avx(auVar125,auVar103,auVar124);
                  auVar103 = vpcmpgtd_avx(auVar127,auVar142);
                  auVar124 = vpshufd_avx(auVar103,0xaa);
                  auVar103 = vblendvps_avx(auVar127,auVar142,auVar124);
                  auVar127 = vblendvps_avx(auVar142,auVar127,auVar124);
                  auVar142 = vpcmpgtd_avx(auVar143,auVar127);
                  auVar142 = vpshufd_avx(auVar142,0xaa);
                  auVar124 = vblendvps_avx(auVar143,auVar127,auVar142);
                  auVar127 = vblendvps_avx(auVar127,auVar143,auVar142);
                  *local_2978 = auVar125;
                  local_2978[1] = auVar127;
                  local_2978[2] = auVar124;
                  uVar75 = auVar103._0_8_;
                  pauVar73 = local_2978 + 3;
                }
                else {
                  *local_2978 = auVar125;
                  local_2978[1] = auVar127;
                  local_2978[2] = auVar103;
                  pauVar73 = local_2978 + 3;
                  local_2978[3] = auVar143;
                  do {
                    lVar70 = 0;
                    if (uVar75 != 0) {
                      for (; (uVar75 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
                      }
                    }
                    auVar104._8_8_ = 0;
                    auVar104._0_8_ = *(ulong *)(uVar69 + lVar70 * 8);
                    auVar125 = vpunpcklqdq_avx(auVar104,ZEXT416(*(uint *)(local_26e0 + lVar70 * 4)))
                    ;
                    pauVar73[1] = auVar125;
                    pauVar73 = pauVar73 + 1;
                    uVar75 = uVar75 & uVar75 - 1;
                  } while (uVar75 != 0);
                  lVar70 = 0;
                  while (pauVar73 != local_2978) {
                    auVar125 = local_2978[1];
                    uVar79 = vextractps_avx(auVar125,2);
                    for (lVar77 = 0x10;
                        (lVar70 != lVar77 && (*(uint *)(local_2978[-1] + lVar77 + 8) < uVar79));
                        lVar77 = lVar77 + -0x10) {
                      *(undefined1 (*) [16])(*local_2978 + lVar77) =
                           *(undefined1 (*) [16])(local_2978[-1] + lVar77);
                    }
                    *(undefined1 (*) [16])(*local_2978 + lVar77) = auVar125;
                    lVar70 = lVar70 + -0x10;
                    local_2978 = local_2978 + 1;
                  }
                  uVar75 = *(ulong *)*pauVar73;
                }
                auVar110 = ZEXT1664(auVar125);
                auVar158 = ZEXT1664(auVar143);
                auVar151 = ZEXT1664(auVar142);
                auVar135 = ZEXT1664(auVar103);
                auVar174 = ZEXT3264(local_28a0);
                local_2978 = pauVar73;
              }
            }
          }
        }
        local_2970 = (ulong)((uint)uVar75 & 0xf) - 8;
        uVar75 = uVar75 & 0xfffffffffffffff0;
        for (local_2948 = 0; local_2948 != local_2970; local_2948 = local_2948 + 1) {
          lVar77 = local_2948 * 0x60;
          pSVar7 = context->scene;
          pRVar8 = (pSVar7->geometries).items;
          pGVar9 = pRVar8[*(uint *)(uVar75 + 0x40 + lVar77)].ptr;
          fVar3 = (pGVar9->time_range).lower;
          fVar3 = pGVar9->fnumTimeSegments *
                  (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar3) /
                  ((pGVar9->time_range).upper - fVar3));
          auVar125 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
          auVar125 = vminss_avx(auVar125,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
          auVar117 = vmaxss_avx(ZEXT816(0) << 0x20,auVar125);
          iVar71 = (int)auVar117._0_4_;
          lVar87 = (long)iVar71 * 0x38;
          lVar70 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar87);
          uVar86 = (ulong)*(uint *)(uVar75 + 4 + lVar77);
          auVar125 = *(undefined1 (*) [16])(lVar70 + (ulong)*(uint *)(uVar75 + lVar77) * 4);
          uVar69 = (ulong)*(uint *)(uVar75 + 0x10 + lVar77);
          auVar127 = *(undefined1 (*) [16])(lVar70 + uVar69 * 4);
          uVar79 = *(uint *)(uVar75 + 0x20 + lVar77);
          auVar103 = *(undefined1 (*) [16])(lVar70 + (ulong)uVar79 * 4);
          uVar80 = (ulong)*(uint *)(uVar75 + 0x30 + lVar77);
          auVar142 = *(undefined1 (*) [16])(lVar70 + uVar80 * 4);
          local_2958 = *(long *)&pRVar8[*(uint *)(uVar75 + 0x44 + lVar77)].ptr[2].numPrimitives;
          lVar70 = *(long *)(local_2958 + lVar87);
          auVar143 = *(undefined1 (*) [16])(lVar70 + uVar86 * 4);
          uVar81 = (ulong)*(uint *)(uVar75 + 0x14 + lVar77);
          auVar124 = *(undefined1 (*) [16])(lVar70 + uVar81 * 4);
          uVar82 = (ulong)*(uint *)(uVar75 + 0x24 + lVar77);
          auVar144 = *(undefined1 (*) [16])(lVar70 + uVar82 * 4);
          uVar83 = (ulong)*(uint *)(uVar75 + 0x34 + lVar77);
          auVar116 = *(undefined1 (*) [16])(lVar70 + uVar83 * 4);
          lVar70 = *(long *)&pRVar8[*(uint *)(uVar75 + 0x48 + lVar77)].ptr[2].numPrimitives;
          lVar10 = *(long *)(lVar70 + lVar87);
          uVar84 = (ulong)*(uint *)(uVar75 + 8 + lVar77);
          auVar126 = *(undefined1 (*) [16])(lVar10 + uVar84 * 4);
          local_2950 = (ulong)*(uint *)(uVar75 + 0x18 + lVar77);
          auVar154 = *(undefined1 (*) [16])(lVar10 + local_2950 * 4);
          uVar89 = CONCAT44(0,*(uint *)(uVar75 + 0x28 + lVar77));
          local_2880._0_8_ = uVar89;
          auVar104 = *(undefined1 (*) [16])(lVar10 + uVar89 * 4);
          uVar90 = (ulong)*(uint *)(uVar75 + 0x38 + lVar77);
          auVar93 = *(undefined1 (*) [16])(lVar10 + uVar90 * 4);
          fVar3 = fVar3 - auVar117._0_4_;
          lVar10 = *(long *)&pRVar8[*(uint *)(uVar75 + 0x4c + lVar77)].ptr[2].numPrimitives;
          lVar87 = *(long *)(lVar10 + lVar87);
          uVar78 = (ulong)*(uint *)(uVar75 + 0xc + lVar77);
          auVar117 = *(undefined1 (*) [16])(lVar87 + uVar78 * 4);
          local_2968 = (ulong)*(uint *)(uVar75 + 0x1c + lVar77);
          auVar145 = *(undefined1 (*) [16])(lVar87 + local_2968 * 4);
          auVar155 = vunpcklps_avx(auVar125,auVar126);
          auVar126 = vunpckhps_avx(auVar125,auVar126);
          auVar244 = vunpcklps_avx(auVar143,auVar117);
          auVar143 = vunpckhps_avx(auVar143,auVar117);
          uVar88 = (ulong)*(uint *)(uVar75 + 0x2c + lVar77);
          auVar125 = *(undefined1 (*) [16])(lVar87 + uVar88 * 4);
          auVar117 = vunpcklps_avx(auVar126,auVar143);
          _local_2710 = vunpcklps_avx(auVar155,auVar244);
          auVar68 = _local_2710;
          auVar143 = vunpckhps_avx(auVar155,auVar244);
          auVar155 = vunpcklps_avx(auVar127,auVar154);
          auVar126 = vunpckhps_avx(auVar127,auVar154);
          auVar154 = vunpcklps_avx(auVar124,auVar145);
          auVar124 = vunpckhps_avx(auVar124,auVar145);
          local_2960 = (ulong)*(uint *)(uVar75 + 0x3c + lVar77);
          auVar127 = *(undefined1 (*) [16])(lVar87 + local_2960 * 4);
          auVar126 = vunpcklps_avx(auVar126,auVar124);
          auVar145 = vunpcklps_avx(auVar155,auVar154);
          _local_2860 = auVar145;
          auVar128 = _local_2860;
          auVar124 = vunpckhps_avx(auVar155,auVar154);
          auVar154 = vunpcklps_avx(auVar103,auVar104);
          auVar103 = vunpckhps_avx(auVar103,auVar104);
          auVar104 = vunpcklps_avx(auVar144,auVar125);
          auVar144 = vunpckhps_avx(auVar144,auVar125);
          lVar74 = (long)(iVar71 + 1) * 0x38;
          lVar87 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar74);
          auVar125 = *(undefined1 (*) [16])(lVar87 + (ulong)*(uint *)(uVar75 + lVar77) * 4);
          _local_2990 = vunpcklps_avx(auVar103,auVar144);
          auVar64 = _local_2990;
          _local_2740 = vunpcklps_avx(auVar154,auVar104);
          auVar65 = _local_2740;
          _local_2730 = vunpckhps_avx(auVar154,auVar104);
          auVar66 = _local_2730;
          auVar144 = vunpcklps_avx(auVar142,auVar93);
          auVar103 = vunpckhps_avx(auVar142,auVar93);
          auVar154 = vunpcklps_avx(auVar116,auVar127);
          auVar142 = vunpckhps_avx(auVar116,auVar127);
          lVar70 = *(long *)(lVar70 + lVar74);
          auVar127 = *(undefined1 (*) [16])(lVar70 + uVar84 * 4);
          _local_29a0 = vunpcklps_avx(auVar103,auVar142);
          auVar63 = _local_29a0;
          auVar104 = vunpcklps_avx(auVar144,auVar154);
          _local_2720 = vunpckhps_avx(auVar144,auVar154);
          auVar67 = _local_2720;
          lVar11 = *(long *)(local_2958 + lVar74);
          auVar142 = vunpcklps_avx(auVar125,auVar127);
          auVar103 = vunpckhps_avx(auVar125,auVar127);
          auVar125 = *(undefined1 (*) [16])(lVar11 + uVar86 * 4);
          lVar10 = *(long *)(lVar10 + lVar74);
          auVar127 = *(undefined1 (*) [16])(lVar10 + uVar78 * 4);
          auVar144 = vunpcklps_avx(auVar125,auVar127);
          auVar125 = vunpckhps_avx(auVar125,auVar127);
          auVar154 = vunpcklps_avx(auVar103,auVar125);
          auVar93 = vunpcklps_avx(auVar142,auVar144);
          auVar103 = vunpckhps_avx(auVar142,auVar144);
          auVar125 = *(undefined1 (*) [16])(lVar87 + uVar69 * 4);
          auVar127 = *(undefined1 (*) [16])(lVar70 + local_2950 * 4);
          auVar144 = vunpcklps_avx(auVar125,auVar127);
          auVar142 = vunpckhps_avx(auVar125,auVar127);
          auVar125 = *(undefined1 (*) [16])(lVar11 + uVar81 * 4);
          auVar127 = *(undefined1 (*) [16])(lVar10 + local_2968 * 4);
          auVar116 = vunpcklps_avx(auVar125,auVar127);
          auVar125 = vunpckhps_avx(auVar125,auVar127);
          auVar155 = vunpcklps_avx(auVar142,auVar125);
          auVar244 = vunpcklps_avx(auVar144,auVar116);
          auVar142 = vunpckhps_avx(auVar144,auVar116);
          auVar125 = *(undefined1 (*) [16])(lVar87 + (ulong)uVar79 * 4);
          auVar127 = *(undefined1 (*) [16])(lVar70 + uVar89 * 4);
          auVar116 = vunpcklps_avx(auVar125,auVar127);
          auVar144 = vunpckhps_avx(auVar125,auVar127);
          auVar125 = *(undefined1 (*) [16])(lVar11 + uVar82 * 4);
          auVar127 = *(undefined1 (*) [16])(lVar10 + uVar88 * 4);
          auVar175 = vunpcklps_avx(auVar125,auVar127);
          auVar125 = vunpckhps_avx(auVar125,auVar127);
          auVar21 = vunpcklps_avx(auVar144,auVar125);
          auVar22 = vunpcklps_avx(auVar116,auVar175);
          auVar144 = vunpckhps_avx(auVar116,auVar175);
          auVar125 = *(undefined1 (*) [16])(lVar87 + uVar80 * 4);
          auVar127 = *(undefined1 (*) [16])(lVar70 + uVar90 * 4);
          auVar175 = vunpcklps_avx(auVar125,auVar127);
          auVar116 = vunpckhps_avx(auVar125,auVar127);
          auVar125 = *(undefined1 (*) [16])(lVar11 + uVar83 * 4);
          auVar127 = *(undefined1 (*) [16])(lVar10 + local_2960 * 4);
          auVar23 = vunpcklps_avx(auVar125,auVar127);
          auVar125 = vunpckhps_avx(auVar125,auVar127);
          auVar24 = vunpcklps_avx(auVar116,auVar125);
          auVar25 = vunpcklps_avx(auVar175,auVar23);
          auVar116 = vunpckhps_avx(auVar175,auVar23);
          auVar125 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
          auVar127 = vshufps_avx(ZEXT416((uint)(1.0 - fVar3)),ZEXT416((uint)(1.0 - fVar3)),0);
          fVar3 = auVar125._0_4_;
          fVar12 = auVar125._4_4_;
          fVar13 = auVar125._8_4_;
          fVar14 = auVar125._12_4_;
          fVar101 = auVar127._0_4_;
          fVar111 = auVar127._4_4_;
          fVar112 = auVar127._8_4_;
          fVar102 = auVar127._12_4_;
          auVar106._4_4_ = fVar111 * (float)local_2710._4_4_ + auVar93._4_4_ * fVar12;
          auVar106._0_4_ = fVar101 * (float)local_2710._0_4_ + auVar93._0_4_ * fVar3;
          auVar106._8_4_ = fVar112 * fStack_2708 + auVar93._8_4_ * fVar13;
          auVar106._12_4_ = fVar102 * fStack_2704 + auVar93._12_4_ * fVar14;
          local_2840._0_4_ = auVar143._0_4_;
          local_2840._4_4_ = auVar143._4_4_;
          fStack_2838 = auVar143._8_4_;
          fStack_2834 = auVar143._12_4_;
          auVar130._4_4_ = fVar111 * (float)local_2840._4_4_ + fVar12 * auVar103._4_4_;
          auVar130._0_4_ = fVar101 * (float)local_2840._0_4_ + fVar3 * auVar103._0_4_;
          auVar130._8_4_ = fVar112 * fStack_2838 + fVar13 * auVar103._8_4_;
          auVar130._12_4_ = fVar102 * fStack_2834 + fVar14 * auVar103._12_4_;
          local_27e0._0_4_ = auVar117._0_4_;
          local_27e0._4_4_ = auVar117._4_4_;
          fStack_27d8 = auVar117._8_4_;
          fStack_27d4 = auVar117._12_4_;
          auVar172._4_4_ = fVar111 * (float)local_27e0._4_4_ + auVar154._4_4_ * fVar12;
          auVar172._0_4_ = fVar101 * (float)local_27e0._0_4_ + auVar154._0_4_ * fVar3;
          auVar172._8_4_ = fVar112 * fStack_27d8 + auVar154._8_4_ * fVar13;
          auVar172._12_4_ = fVar102 * fStack_27d4 + auVar154._12_4_ * fVar14;
          local_2860._0_4_ = auVar145._0_4_;
          local_2860._4_4_ = auVar145._4_4_;
          fStack_2858 = auVar145._8_4_;
          fStack_2854 = auVar145._12_4_;
          auVar175._0_4_ = fVar101 * (float)local_2860._0_4_ + fVar3 * auVar244._0_4_;
          auVar175._4_4_ = fVar111 * (float)local_2860._4_4_ + fVar12 * auVar244._4_4_;
          auVar175._8_4_ = fVar112 * fStack_2858 + fVar13 * auVar244._8_4_;
          auVar175._12_4_ = fVar102 * fStack_2854 + fVar14 * auVar244._12_4_;
          local_2820._0_4_ = auVar124._0_4_;
          local_2820._4_4_ = auVar124._4_4_;
          fStack_2818 = auVar124._8_4_;
          fStack_2814 = auVar124._12_4_;
          auVar117._0_4_ = fVar101 * (float)local_2820._0_4_ + auVar142._0_4_ * fVar3;
          auVar117._4_4_ = fVar111 * (float)local_2820._4_4_ + auVar142._4_4_ * fVar12;
          auVar117._8_4_ = fVar112 * fStack_2818 + auVar142._8_4_ * fVar13;
          auVar117._12_4_ = fVar102 * fStack_2814 + auVar142._12_4_ * fVar14;
          local_27c0._0_4_ = auVar126._0_4_;
          local_27c0._4_4_ = auVar126._4_4_;
          fStack_27b8 = auVar126._8_4_;
          fStack_27b4 = auVar126._12_4_;
          auVar244._0_4_ = fVar101 * (float)local_27c0._0_4_ + auVar155._0_4_ * fVar3;
          auVar244._4_4_ = fVar111 * (float)local_27c0._4_4_ + auVar155._4_4_ * fVar12;
          auVar244._8_4_ = fVar112 * fStack_27b8 + auVar155._8_4_ * fVar13;
          auVar244._12_4_ = fVar102 * fStack_27b4 + auVar155._12_4_ * fVar14;
          auVar106._20_4_ = fVar111 * (float)local_2740._4_4_ + fVar12 * auVar22._4_4_;
          auVar106._16_4_ = fVar101 * (float)local_2740._0_4_ + fVar3 * auVar22._0_4_;
          auVar106._24_4_ = fVar112 * fStack_2738 + fVar13 * auVar22._8_4_;
          auVar106._28_4_ = fVar102 * fStack_2734 + fVar14 * auVar22._12_4_;
          auVar130._20_4_ = fVar111 * (float)local_2730._4_4_ + auVar144._4_4_ * fVar12;
          auVar130._16_4_ = fVar101 * (float)local_2730._0_4_ + auVar144._0_4_ * fVar3;
          auVar130._24_4_ = fVar112 * fStack_2728 + auVar144._8_4_ * fVar13;
          auVar130._28_4_ = fVar102 * fStack_2724 + auVar144._12_4_ * fVar14;
          auVar172._20_4_ = fVar111 * (float)local_2990._4_4_ + auVar21._4_4_ * fVar12;
          auVar172._16_4_ = fVar101 * (float)local_2990._0_4_ + auVar21._0_4_ * fVar3;
          auVar172._24_4_ = fVar112 * fStack_2988 + auVar21._8_4_ * fVar13;
          auVar172._28_4_ = fVar102 * fStack_2984 + auVar21._12_4_ * fVar14;
          lVar70 = uVar75 + 0x40 + lVar77;
          local_23c0 = *(undefined8 *)(lVar70 + 0x10);
          uStack_23b8 = *(undefined8 *)(lVar70 + 0x18);
          auVar145._0_4_ = auVar104._0_4_ * fVar101 + fVar3 * auVar25._0_4_;
          auVar145._4_4_ = auVar104._4_4_ * fVar111 + fVar12 * auVar25._4_4_;
          auVar145._8_4_ = auVar104._8_4_ * fVar112 + fVar13 * auVar25._8_4_;
          auVar145._12_4_ = auVar104._12_4_ * fVar102 + fVar14 * auVar25._12_4_;
          uStack_23b0 = local_23c0;
          uStack_23a8 = uStack_23b8;
          lVar77 = uVar75 + 0x50 + lVar77;
          local_2700 = *(undefined8 *)(lVar77 + 0x10);
          uStack_26f8 = *(undefined8 *)(lVar77 + 0x18);
          auVar155._0_4_ = fVar101 * (float)local_2720._0_4_ + fVar3 * auVar116._0_4_;
          auVar155._4_4_ = fVar111 * (float)local_2720._4_4_ + fVar12 * auVar116._4_4_;
          auVar155._8_4_ = fVar112 * fStack_2718 + fVar13 * auVar116._8_4_;
          auVar155._12_4_ = fVar102 * fStack_2714 + fVar14 * auVar116._12_4_;
          auVar93._0_4_ = fVar101 * (float)local_29a0._0_4_ + fVar3 * auVar24._0_4_;
          auVar93._4_4_ = fVar111 * (float)local_29a0._4_4_ + fVar12 * auVar24._4_4_;
          auVar93._8_4_ = fVar112 * fStack_2998 + fVar13 * auVar24._8_4_;
          auVar93._12_4_ = fVar102 * fStack_2994 + fVar14 * auVar24._12_4_;
          uStack_26f0 = local_2700;
          uStack_26e8 = uStack_26f8;
          auVar176._16_16_ = auVar175;
          auVar176._0_16_ = auVar175;
          auVar120._16_16_ = auVar117;
          auVar120._0_16_ = auVar117;
          auVar182._16_16_ = auVar244;
          auVar182._0_16_ = auVar244;
          auVar204._16_16_ = auVar145;
          auVar204._0_16_ = auVar145;
          auVar157._16_16_ = auVar155;
          auVar157._0_16_ = auVar155;
          auVar213._16_16_ = auVar93;
          auVar213._0_16_ = auVar93;
          uVar4 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar216._4_4_ = uVar4;
          auVar216._0_4_ = uVar4;
          auVar216._8_4_ = uVar4;
          auVar216._12_4_ = uVar4;
          auVar216._16_4_ = uVar4;
          auVar216._20_4_ = uVar4;
          auVar216._24_4_ = uVar4;
          auVar216._28_4_ = uVar4;
          uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar225._4_4_ = uVar4;
          auVar225._0_4_ = uVar4;
          auVar225._8_4_ = uVar4;
          auVar225._12_4_ = uVar4;
          auVar225._16_4_ = uVar4;
          auVar225._20_4_ = uVar4;
          auVar225._24_4_ = uVar4;
          auVar225._28_4_ = uVar4;
          uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar235._4_4_ = uVar4;
          auVar235._0_4_ = uVar4;
          auVar235._8_4_ = uVar4;
          auVar235._12_4_ = uVar4;
          auVar235._16_4_ = uVar4;
          auVar235._20_4_ = uVar4;
          auVar235._24_4_ = uVar4;
          auVar235._28_4_ = uVar4;
          local_28e0 = vsubps_avx(auVar106,auVar216);
          local_2760 = vsubps_avx(auVar130,auVar225);
          local_2780 = vsubps_avx(auVar172,auVar235);
          auVar118 = vsubps_avx(auVar176,auVar216);
          auVar146 = vsubps_avx(auVar120,auVar225);
          auVar15 = vsubps_avx(auVar182,auVar235);
          auVar16 = vsubps_avx(auVar204,auVar216);
          auVar17 = vsubps_avx(auVar157,auVar225);
          auVar18 = vsubps_avx(auVar213,auVar235);
          local_27a0 = vsubps_avx(auVar16,local_28e0);
          _local_27c0 = vsubps_avx(auVar17,local_2760);
          _local_27e0 = vsubps_avx(auVar18,local_2780);
          fVar3 = local_2760._0_4_;
          fVar152 = auVar17._0_4_ + fVar3;
          fVar12 = local_2760._4_4_;
          fVar159 = auVar17._4_4_ + fVar12;
          fVar13 = local_2760._8_4_;
          fVar161 = auVar17._8_4_ + fVar13;
          fVar14 = local_2760._12_4_;
          fVar163 = auVar17._12_4_ + fVar14;
          fVar101 = local_2760._16_4_;
          fVar165 = auVar17._16_4_ + fVar101;
          fVar111 = local_2760._20_4_;
          fVar167 = auVar17._20_4_ + fVar111;
          fVar112 = local_2760._24_4_;
          fVar169 = auVar17._24_4_ + fVar112;
          fVar102 = local_2760._28_4_;
          fVar253 = local_2780._0_4_;
          fVar179 = fVar253 + auVar18._0_4_;
          fVar255 = local_2780._4_4_;
          fVar184 = fVar255 + auVar18._4_4_;
          fVar256 = local_2780._8_4_;
          fVar187 = fVar256 + auVar18._8_4_;
          fVar257 = local_2780._12_4_;
          fVar190 = fVar257 + auVar18._12_4_;
          fVar258 = local_2780._16_4_;
          fVar193 = fVar258 + auVar18._16_4_;
          fVar259 = local_2780._20_4_;
          fVar196 = fVar259 + auVar18._20_4_;
          fVar260 = local_2780._24_4_;
          fVar199 = fVar260 + auVar18._24_4_;
          fVar123 = local_2780._28_4_;
          fVar113 = local_27e0._0_4_;
          fVar114 = local_27e0._4_4_;
          auVar27._4_4_ = fVar114 * fVar159;
          auVar27._0_4_ = fVar113 * fVar152;
          fVar115 = local_27e0._8_4_;
          auVar27._8_4_ = fVar115 * fVar161;
          fVar97 = local_27e0._12_4_;
          auVar27._12_4_ = fVar97 * fVar163;
          fVar98 = local_27e0._16_4_;
          auVar27._16_4_ = fVar98 * fVar165;
          fVar99 = local_27e0._20_4_;
          auVar27._20_4_ = fVar99 * fVar167;
          fVar100 = local_27e0._24_4_;
          auVar27._24_4_ = fVar100 * fVar169;
          auVar27._28_4_ = auVar145._12_4_;
          fVar224 = local_27c0._0_4_;
          fVar228 = local_27c0._4_4_;
          auVar28._4_4_ = fVar228 * fVar184;
          auVar28._0_4_ = fVar224 * fVar179;
          fVar229 = local_27c0._8_4_;
          auVar28._8_4_ = fVar229 * fVar187;
          fVar230 = local_27c0._12_4_;
          auVar28._12_4_ = fVar230 * fVar190;
          fVar231 = local_27c0._16_4_;
          auVar28._16_4_ = fVar231 * fVar193;
          fVar232 = local_27c0._20_4_;
          auVar28._20_4_ = fVar232 * fVar196;
          fVar233 = local_27c0._24_4_;
          auVar28._24_4_ = fVar233 * fVar199;
          auVar28._28_4_ = auVar93._12_4_;
          auVar19 = vsubps_avx(auVar28,auVar27);
          fVar243 = local_28e0._0_4_;
          fVar202 = fVar243 + auVar16._0_4_;
          fVar247 = local_28e0._4_4_;
          fVar206 = fVar247 + auVar16._4_4_;
          fVar248 = local_28e0._8_4_;
          fVar208 = fVar248 + auVar16._8_4_;
          fVar249 = local_28e0._12_4_;
          fVar209 = fVar249 + auVar16._12_4_;
          fVar250 = local_28e0._16_4_;
          fVar210 = fVar250 + auVar16._16_4_;
          fVar251 = local_28e0._20_4_;
          fVar211 = fVar251 + auVar16._20_4_;
          fVar252 = local_28e0._24_4_;
          fVar212 = fVar252 + auVar16._24_4_;
          fVar215 = local_27a0._0_4_;
          fVar218 = local_27a0._4_4_;
          auVar29._4_4_ = fVar218 * fVar184;
          auVar29._0_4_ = fVar215 * fVar179;
          fVar219 = local_27a0._8_4_;
          auVar29._8_4_ = fVar219 * fVar187;
          fVar220 = local_27a0._12_4_;
          auVar29._12_4_ = fVar220 * fVar190;
          fVar221 = local_27a0._16_4_;
          auVar29._16_4_ = fVar221 * fVar193;
          fVar222 = local_27a0._20_4_;
          auVar29._20_4_ = fVar222 * fVar196;
          fVar223 = local_27a0._24_4_;
          auVar29._24_4_ = fVar223 * fVar199;
          auVar29._28_4_ = fVar123 + auVar18._28_4_;
          auVar147 = _local_27e0;
          auVar30._4_4_ = fVar206 * fVar114;
          auVar30._0_4_ = fVar202 * fVar113;
          auVar30._8_4_ = fVar208 * fVar115;
          auVar30._12_4_ = fVar209 * fVar97;
          auVar30._16_4_ = fVar210 * fVar98;
          auVar30._20_4_ = fVar211 * fVar99;
          auVar30._24_4_ = fVar212 * fVar100;
          auVar30._28_4_ = auVar93._12_4_;
          auVar20 = vsubps_avx(auVar30,auVar29);
          auVar31._4_4_ = fVar228 * fVar206;
          auVar31._0_4_ = fVar224 * fVar202;
          auVar31._8_4_ = fVar229 * fVar208;
          auVar31._12_4_ = fVar230 * fVar209;
          auVar31._16_4_ = fVar231 * fVar210;
          auVar31._20_4_ = fVar232 * fVar211;
          auVar31._24_4_ = fVar233 * fVar212;
          auVar31._28_4_ = local_28e0._28_4_ + auVar16._28_4_;
          auVar32._4_4_ = fVar218 * fVar159;
          auVar32._0_4_ = fVar215 * fVar152;
          auVar32._8_4_ = fVar219 * fVar161;
          auVar32._12_4_ = fVar220 * fVar163;
          auVar32._16_4_ = fVar221 * fVar165;
          auVar32._20_4_ = fVar222 * fVar167;
          auVar32._24_4_ = fVar223 * fVar169;
          auVar32._28_4_ = auVar17._28_4_ + fVar102;
          auVar105 = vsubps_avx(auVar32,auVar31);
          local_2a20._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
          local_2a00._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
          local_29c0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
          local_29c0._0_4_ = local_29c0._4_4_;
          fStack_29b8 = (float)local_29c0._4_4_;
          fStack_29b4 = (float)local_29c0._4_4_;
          fStack_29b0 = (float)local_29c0._4_4_;
          fStack_29ac = (float)local_29c0._4_4_;
          fStack_29a8 = (float)local_29c0._4_4_;
          fStack_29a4 = (float)local_29c0._4_4_;
          local_29e0 = (float)local_29c0._4_4_ * auVar19._0_4_ +
                       (float)local_2a20._4_4_ * auVar20._0_4_ + local_2a00._4_4_ * auVar105._0_4_;
          fStack_29dc = (float)local_29c0._4_4_ * auVar19._4_4_ +
                        (float)local_2a20._4_4_ * auVar20._4_4_ + local_2a00._4_4_ * auVar105._4_4_;
          fStack_29d8 = (float)local_29c0._4_4_ * auVar19._8_4_ +
                        (float)local_2a20._4_4_ * auVar20._8_4_ + local_2a00._4_4_ * auVar105._8_4_;
          fStack_29d4 = (float)local_29c0._4_4_ * auVar19._12_4_ +
                        (float)local_2a20._4_4_ * auVar20._12_4_ +
                        local_2a00._4_4_ * auVar105._12_4_;
          fStack_29d0 = (float)local_29c0._4_4_ * auVar19._16_4_ +
                        (float)local_2a20._4_4_ * auVar20._16_4_ +
                        local_2a00._4_4_ * auVar105._16_4_;
          fStack_29cc = (float)local_29c0._4_4_ * auVar19._20_4_ +
                        (float)local_2a20._4_4_ * auVar20._20_4_ +
                        local_2a00._4_4_ * auVar105._20_4_;
          fStack_29c8 = (float)local_29c0._4_4_ * auVar19._24_4_ +
                        (float)local_2a20._4_4_ * auVar20._24_4_ +
                        local_2a00._4_4_ * auVar105._24_4_;
          fStack_29c4 = auVar20._28_4_ + auVar20._28_4_ + auVar105._28_4_;
          auVar19 = vsubps_avx(local_2760,auVar146);
          _local_2820 = vsubps_avx(local_2780,auVar15);
          fVar206 = fVar3 + auVar146._0_4_;
          fVar208 = fVar12 + auVar146._4_4_;
          fVar209 = fVar13 + auVar146._8_4_;
          fVar210 = fVar14 + auVar146._12_4_;
          fVar211 = fVar101 + auVar146._16_4_;
          fVar212 = fVar111 + auVar146._20_4_;
          fVar170 = fVar112 + auVar146._24_4_;
          fVar184 = fVar253 + auVar15._0_4_;
          fVar187 = fVar255 + auVar15._4_4_;
          fVar190 = fVar256 + auVar15._8_4_;
          fVar193 = fVar257 + auVar15._12_4_;
          fVar196 = fVar258 + auVar15._16_4_;
          fVar199 = fVar259 + auVar15._20_4_;
          fVar202 = fVar260 + auVar15._24_4_;
          fVar152 = auVar15._28_4_;
          fVar159 = local_2820._0_4_;
          fVar161 = local_2820._4_4_;
          auVar33._4_4_ = fVar161 * fVar208;
          auVar33._0_4_ = fVar159 * fVar206;
          fVar163 = local_2820._8_4_;
          auVar33._8_4_ = fVar163 * fVar209;
          fVar165 = local_2820._12_4_;
          auVar33._12_4_ = fVar165 * fVar210;
          fVar167 = local_2820._16_4_;
          auVar33._16_4_ = fVar167 * fVar211;
          fVar169 = local_2820._20_4_;
          auVar33._20_4_ = fVar169 * fVar212;
          fVar179 = local_2820._24_4_;
          auVar33._24_4_ = fVar179 * fVar170;
          auVar33._28_4_ = fVar123;
          fVar180 = auVar19._0_4_;
          fVar185 = auVar19._4_4_;
          auVar34._4_4_ = fVar185 * fVar187;
          auVar34._0_4_ = fVar180 * fVar184;
          fVar188 = auVar19._8_4_;
          auVar34._8_4_ = fVar188 * fVar190;
          fVar191 = auVar19._12_4_;
          auVar34._12_4_ = fVar191 * fVar193;
          fVar194 = auVar19._16_4_;
          auVar34._16_4_ = fVar194 * fVar196;
          fVar197 = auVar19._20_4_;
          auVar34._20_4_ = fVar197 * fVar199;
          fVar200 = auVar19._24_4_;
          auVar34._24_4_ = fVar200 * fVar202;
          auVar34._28_4_ = fVar102;
          auVar20 = vsubps_avx(auVar34,auVar33);
          local_2800 = vsubps_avx(local_28e0,auVar118);
          fVar234 = local_2800._0_4_;
          fVar237 = local_2800._4_4_;
          auVar35._4_4_ = fVar237 * fVar187;
          auVar35._0_4_ = fVar234 * fVar184;
          fVar238 = local_2800._8_4_;
          auVar35._8_4_ = fVar238 * fVar190;
          fVar239 = local_2800._12_4_;
          auVar35._12_4_ = fVar239 * fVar193;
          fVar240 = local_2800._16_4_;
          auVar35._16_4_ = fVar240 * fVar196;
          fVar241 = local_2800._20_4_;
          auVar35._20_4_ = fVar241 * fVar199;
          fVar242 = local_2800._24_4_;
          auVar35._24_4_ = fVar242 * fVar202;
          auVar35._28_4_ = fVar123 + fVar152;
          fVar184 = fVar243 + auVar118._0_4_;
          fVar187 = fVar247 + auVar118._4_4_;
          fVar190 = fVar248 + auVar118._8_4_;
          fVar193 = fVar249 + auVar118._12_4_;
          fVar196 = fVar250 + auVar118._16_4_;
          fVar199 = fVar251 + auVar118._20_4_;
          fVar202 = fVar252 + auVar118._24_4_;
          auVar129 = _local_2820;
          auVar36._4_4_ = fVar187 * fVar161;
          auVar36._0_4_ = fVar184 * fVar159;
          auVar36._8_4_ = fVar190 * fVar163;
          auVar36._12_4_ = fVar193 * fVar165;
          auVar36._16_4_ = fVar196 * fVar167;
          auVar36._20_4_ = fVar199 * fVar169;
          auVar36._24_4_ = fVar202 * fVar179;
          auVar36._28_4_ = local_27c0._28_4_;
          auVar105 = vsubps_avx(auVar36,auVar35);
          auVar37._4_4_ = fVar185 * fVar187;
          auVar37._0_4_ = fVar180 * fVar184;
          auVar37._8_4_ = fVar188 * fVar190;
          auVar37._12_4_ = fVar191 * fVar193;
          auVar37._16_4_ = fVar194 * fVar196;
          auVar37._20_4_ = fVar197 * fVar199;
          auVar37._24_4_ = fVar200 * fVar202;
          auVar37._28_4_ = local_28e0._28_4_ + auVar118._28_4_;
          auVar38._4_4_ = fVar237 * fVar208;
          auVar38._0_4_ = fVar234 * fVar206;
          auVar38._8_4_ = fVar238 * fVar209;
          auVar38._12_4_ = fVar239 * fVar210;
          auVar38._16_4_ = fVar240 * fVar211;
          auVar38._20_4_ = fVar241 * fVar212;
          auVar38._24_4_ = fVar242 * fVar170;
          auVar38._28_4_ = fVar102 + auVar146._28_4_;
          auVar119 = vsubps_avx(auVar38,auVar37);
          auVar245._0_4_ =
               (float)local_29c0._4_4_ * auVar20._0_4_ +
               (float)local_2a20._4_4_ * auVar105._0_4_ + local_2a00._4_4_ * auVar119._0_4_;
          auVar245._4_4_ =
               (float)local_29c0._4_4_ * auVar20._4_4_ +
               (float)local_2a20._4_4_ * auVar105._4_4_ + local_2a00._4_4_ * auVar119._4_4_;
          auVar245._8_4_ =
               (float)local_29c0._4_4_ * auVar20._8_4_ +
               (float)local_2a20._4_4_ * auVar105._8_4_ + local_2a00._4_4_ * auVar119._8_4_;
          auVar245._12_4_ =
               (float)local_29c0._4_4_ * auVar20._12_4_ +
               (float)local_2a20._4_4_ * auVar105._12_4_ + local_2a00._4_4_ * auVar119._12_4_;
          auVar245._16_4_ =
               (float)local_29c0._4_4_ * auVar20._16_4_ +
               (float)local_2a20._4_4_ * auVar105._16_4_ + local_2a00._4_4_ * auVar119._16_4_;
          auVar245._20_4_ =
               (float)local_29c0._4_4_ * auVar20._20_4_ +
               (float)local_2a20._4_4_ * auVar105._20_4_ + local_2a00._4_4_ * auVar119._20_4_;
          auVar245._24_4_ =
               (float)local_29c0._4_4_ * auVar20._24_4_ +
               (float)local_2a20._4_4_ * auVar105._24_4_ + local_2a00._4_4_ * auVar119._24_4_;
          auVar245._28_4_ = auVar20._28_4_ + auVar105._28_4_ + auVar119._28_4_;
          auVar105 = vsubps_avx(auVar118,auVar16);
          fVar102 = auVar118._0_4_ + auVar16._0_4_;
          fVar184 = auVar118._4_4_ + auVar16._4_4_;
          fVar187 = auVar118._8_4_ + auVar16._8_4_;
          fVar190 = auVar118._12_4_ + auVar16._12_4_;
          fVar193 = auVar118._16_4_ + auVar16._16_4_;
          fVar196 = auVar118._20_4_ + auVar16._20_4_;
          fVar199 = auVar118._24_4_ + auVar16._24_4_;
          auVar119 = vsubps_avx(auVar146,auVar17);
          fVar202 = auVar146._0_4_ + auVar17._0_4_;
          fVar206 = auVar146._4_4_ + auVar17._4_4_;
          fVar208 = auVar146._8_4_ + auVar17._8_4_;
          fVar209 = auVar146._12_4_ + auVar17._12_4_;
          fVar210 = auVar146._16_4_ + auVar17._16_4_;
          fVar211 = auVar146._20_4_ + auVar17._20_4_;
          fVar212 = auVar146._24_4_ + auVar17._24_4_;
          fVar170 = auVar146._28_4_ + auVar17._28_4_;
          auVar146 = vsubps_avx(auVar15,auVar18);
          auVar158 = ZEXT3264(auVar146);
          fVar123 = auVar15._0_4_ + auVar18._0_4_;
          fVar136 = auVar15._4_4_ + auVar18._4_4_;
          fVar137 = auVar15._8_4_ + auVar18._8_4_;
          fVar138 = auVar15._12_4_ + auVar18._12_4_;
          fVar139 = auVar15._16_4_ + auVar18._16_4_;
          fVar140 = auVar15._20_4_ + auVar18._20_4_;
          fVar141 = auVar15._24_4_ + auVar18._24_4_;
          fVar153 = auVar146._0_4_;
          fVar160 = auVar146._4_4_;
          auVar39._4_4_ = fVar160 * fVar206;
          auVar39._0_4_ = fVar153 * fVar202;
          fVar162 = auVar146._8_4_;
          auVar39._8_4_ = fVar162 * fVar208;
          fVar164 = auVar146._12_4_;
          auVar39._12_4_ = fVar164 * fVar209;
          fVar166 = auVar146._16_4_;
          auVar39._16_4_ = fVar166 * fVar210;
          fVar168 = auVar146._20_4_;
          auVar39._20_4_ = fVar168 * fVar211;
          fVar171 = auVar146._24_4_;
          auVar39._24_4_ = fVar171 * fVar212;
          auVar39._28_4_ = auVar20._28_4_;
          fVar181 = auVar119._0_4_;
          fVar186 = auVar119._4_4_;
          auVar40._4_4_ = fVar186 * fVar136;
          auVar40._0_4_ = fVar181 * fVar123;
          fVar189 = auVar119._8_4_;
          auVar40._8_4_ = fVar189 * fVar137;
          fVar192 = auVar119._12_4_;
          auVar40._12_4_ = fVar192 * fVar138;
          fVar195 = auVar119._16_4_;
          auVar40._16_4_ = fVar195 * fVar139;
          fVar198 = auVar119._20_4_;
          auVar40._20_4_ = fVar198 * fVar140;
          fVar201 = auVar119._24_4_;
          auVar40._24_4_ = fVar201 * fVar141;
          auVar40._28_4_ = fVar152;
          auVar146 = vsubps_avx(auVar40,auVar39);
          fVar203 = auVar105._0_4_;
          fVar207 = auVar105._4_4_;
          auVar41._4_4_ = fVar207 * fVar136;
          auVar41._0_4_ = fVar203 * fVar123;
          fVar123 = auVar105._8_4_;
          auVar41._8_4_ = fVar123 * fVar137;
          fVar136 = auVar105._12_4_;
          auVar41._12_4_ = fVar136 * fVar138;
          fVar137 = auVar105._16_4_;
          auVar41._16_4_ = fVar137 * fVar139;
          fVar138 = auVar105._20_4_;
          auVar41._20_4_ = fVar138 * fVar140;
          fVar139 = auVar105._24_4_;
          auVar41._24_4_ = fVar139 * fVar141;
          auVar41._28_4_ = fVar152 + auVar18._28_4_;
          auVar42._4_4_ = fVar160 * fVar184;
          auVar42._0_4_ = fVar153 * fVar102;
          auVar42._8_4_ = fVar162 * fVar187;
          auVar42._12_4_ = fVar164 * fVar190;
          auVar42._16_4_ = fVar166 * fVar193;
          auVar42._20_4_ = fVar168 * fVar196;
          auVar42._24_4_ = fVar171 * fVar199;
          auVar42._28_4_ = fVar152;
          auVar15 = vsubps_avx(auVar42,auVar41);
          auVar43._4_4_ = fVar186 * fVar184;
          auVar43._0_4_ = fVar181 * fVar102;
          auVar43._8_4_ = fVar189 * fVar187;
          auVar43._12_4_ = fVar192 * fVar190;
          auVar43._16_4_ = fVar195 * fVar193;
          auVar43._20_4_ = fVar198 * fVar196;
          auVar43._24_4_ = fVar201 * fVar199;
          auVar43._28_4_ = auVar118._28_4_ + auVar16._28_4_;
          auVar44._4_4_ = fVar207 * fVar206;
          auVar44._0_4_ = fVar203 * fVar202;
          auVar44._8_4_ = fVar123 * fVar208;
          auVar44._12_4_ = fVar136 * fVar209;
          auVar44._16_4_ = fVar137 * fVar210;
          auVar44._20_4_ = fVar138 * fVar211;
          auVar44._24_4_ = fVar139 * fVar212;
          auVar44._28_4_ = fVar170;
          auVar118 = vsubps_avx(auVar44,auVar43);
          local_2a00._0_4_ = local_2a00._4_4_;
          fStack_29f8 = local_2a00._4_4_;
          fStack_29f4 = local_2a00._4_4_;
          fStack_29f0 = local_2a00._4_4_;
          fStack_29ec = local_2a00._4_4_;
          fStack_29e8 = local_2a00._4_4_;
          fStack_29e4 = local_2a00._4_4_;
          local_2a20._0_4_ = local_2a20._4_4_;
          fStack_2a18 = (float)local_2a20._4_4_;
          fStack_2a14 = (float)local_2a20._4_4_;
          fStack_2a10 = (float)local_2a20._4_4_;
          fStack_2a0c = (float)local_2a20._4_4_;
          fStack_2a08 = (float)local_2a20._4_4_;
          fStack_2a04 = (float)local_2a20._4_4_;
          auVar107._0_4_ =
               (float)local_29c0._4_4_ * auVar146._0_4_ +
               (float)local_2a20._4_4_ * auVar15._0_4_ + local_2a00._4_4_ * auVar118._0_4_;
          auVar107._4_4_ =
               (float)local_29c0._4_4_ * auVar146._4_4_ +
               (float)local_2a20._4_4_ * auVar15._4_4_ + local_2a00._4_4_ * auVar118._4_4_;
          auVar107._8_4_ =
               (float)local_29c0._4_4_ * auVar146._8_4_ +
               (float)local_2a20._4_4_ * auVar15._8_4_ + local_2a00._4_4_ * auVar118._8_4_;
          auVar107._12_4_ =
               (float)local_29c0._4_4_ * auVar146._12_4_ +
               (float)local_2a20._4_4_ * auVar15._12_4_ + local_2a00._4_4_ * auVar118._12_4_;
          auVar107._16_4_ =
               (float)local_29c0._4_4_ * auVar146._16_4_ +
               (float)local_2a20._4_4_ * auVar15._16_4_ + local_2a00._4_4_ * auVar118._16_4_;
          auVar107._20_4_ =
               (float)local_29c0._4_4_ * auVar146._20_4_ +
               (float)local_2a20._4_4_ * auVar15._20_4_ + local_2a00._4_4_ * auVar118._20_4_;
          auVar107._24_4_ =
               (float)local_29c0._4_4_ * auVar146._24_4_ +
               (float)local_2a20._4_4_ * auVar15._24_4_ + local_2a00._4_4_ * auVar118._24_4_;
          auVar107._28_4_ = fVar170 + fVar170 + auVar118._28_4_;
          auVar62._4_4_ = fStack_29dc;
          auVar62._0_4_ = local_29e0;
          auVar62._8_4_ = fStack_29d8;
          auVar62._12_4_ = fStack_29d4;
          auVar62._16_4_ = fStack_29d0;
          auVar62._20_4_ = fStack_29cc;
          auVar62._24_4_ = fStack_29c8;
          auVar62._28_4_ = fStack_29c4;
          local_26a0._0_4_ = auVar107._0_4_ + auVar245._0_4_ + local_29e0;
          local_26a0._4_4_ = auVar107._4_4_ + auVar245._4_4_ + fStack_29dc;
          local_26a0._8_4_ = auVar107._8_4_ + auVar245._8_4_ + fStack_29d8;
          local_26a0._12_4_ = auVar107._12_4_ + auVar245._12_4_ + fStack_29d4;
          local_26a0._16_4_ = auVar107._16_4_ + auVar245._16_4_ + fStack_29d0;
          local_26a0._20_4_ = auVar107._20_4_ + auVar245._20_4_ + fStack_29cc;
          local_26a0._24_4_ = auVar107._24_4_ + auVar245._24_4_ + fStack_29c8;
          local_26a0._28_4_ = auVar107._28_4_ + auVar245._28_4_ + fStack_29c4;
          auVar118 = vminps_avx(auVar62,auVar245);
          auVar118 = vminps_avx(auVar118,auVar107);
          auVar131._8_4_ = 0x7fffffff;
          auVar131._0_8_ = 0x7fffffff7fffffff;
          auVar131._12_4_ = 0x7fffffff;
          auVar131._16_4_ = 0x7fffffff;
          auVar131._20_4_ = 0x7fffffff;
          auVar131._24_4_ = 0x7fffffff;
          auVar131._28_4_ = 0x7fffffff;
          _local_2840 = vandps_avx(local_26a0,auVar131);
          fVar102 = local_2840._0_4_ * 1.1920929e-07;
          fVar152 = local_2840._4_4_ * 1.1920929e-07;
          auVar45._4_4_ = fVar152;
          auVar45._0_4_ = fVar102;
          fVar184 = local_2840._8_4_ * 1.1920929e-07;
          auVar45._8_4_ = fVar184;
          fVar187 = local_2840._12_4_ * 1.1920929e-07;
          auVar45._12_4_ = fVar187;
          fVar190 = local_2840._16_4_ * 1.1920929e-07;
          auVar45._16_4_ = fVar190;
          fVar193 = local_2840._20_4_ * 1.1920929e-07;
          auVar45._20_4_ = fVar193;
          fVar196 = local_2840._24_4_ * 1.1920929e-07;
          auVar45._24_4_ = fVar196;
          auVar45._28_4_ = 0x34000000;
          auVar135 = ZEXT3264(auVar45);
          auVar149._0_8_ = CONCAT44(fVar152,fVar102) ^ 0x8000000080000000;
          auVar149._8_4_ = -fVar184;
          auVar149._12_4_ = -fVar187;
          auVar149._16_4_ = -fVar190;
          auVar149._20_4_ = -fVar193;
          auVar149._24_4_ = -fVar196;
          auVar149._28_4_ = 0xb4000000;
          auVar118 = vcmpps_avx(auVar118,auVar149,5);
          auVar15 = vmaxps_avx(auVar62,auVar245);
          auVar151 = ZEXT3264(auVar15);
          auVar146 = vmaxps_avx(auVar15,auVar107);
          auVar146 = vcmpps_avx(auVar146,auVar45,2);
          auVar146 = vorps_avx(auVar118,auVar146);
          _local_2860 = auVar128;
          if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar146 >> 0x7f,0) != '\0') ||
                (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar146 >> 0xbf,0) != '\0') ||
              (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar146[0x1f] < '\0') {
            auVar46._4_4_ = fVar185 * fVar114;
            auVar46._0_4_ = fVar180 * fVar113;
            auVar46._8_4_ = fVar188 * fVar115;
            auVar46._12_4_ = fVar191 * fVar97;
            auVar46._16_4_ = fVar194 * fVar98;
            auVar46._20_4_ = fVar197 * fVar99;
            auVar46._24_4_ = fVar200 * fVar100;
            auVar46._28_4_ = auVar118._28_4_;
            auVar47._4_4_ = fVar228 * fVar161;
            auVar47._0_4_ = fVar224 * fVar159;
            auVar47._8_4_ = fVar229 * fVar163;
            auVar47._12_4_ = fVar230 * fVar165;
            auVar47._16_4_ = fVar231 * fVar167;
            auVar47._20_4_ = fVar232 * fVar169;
            auVar47._24_4_ = fVar233 * fVar179;
            auVar47._28_4_ = 0x34000000;
            auVar16 = vsubps_avx(auVar47,auVar46);
            auVar48._4_4_ = fVar186 * fVar161;
            auVar48._0_4_ = fVar181 * fVar159;
            auVar48._8_4_ = fVar189 * fVar163;
            auVar48._12_4_ = fVar192 * fVar165;
            auVar48._16_4_ = fVar195 * fVar167;
            auVar48._20_4_ = fVar198 * fVar169;
            auVar48._24_4_ = fVar201 * fVar179;
            auVar48._28_4_ = auVar15._28_4_;
            auVar49._4_4_ = fVar185 * fVar160;
            auVar49._0_4_ = fVar180 * fVar153;
            auVar49._8_4_ = fVar188 * fVar162;
            auVar49._12_4_ = fVar191 * fVar164;
            auVar49._16_4_ = fVar194 * fVar166;
            auVar49._20_4_ = fVar197 * fVar168;
            auVar49._24_4_ = fVar200 * fVar171;
            auVar49._28_4_ = auVar105._28_4_;
            auVar17 = vsubps_avx(auVar49,auVar48);
            auVar226._8_4_ = 0x7fffffff;
            auVar226._0_8_ = 0x7fffffff7fffffff;
            auVar226._12_4_ = 0x7fffffff;
            auVar226._16_4_ = 0x7fffffff;
            auVar226._20_4_ = 0x7fffffff;
            auVar226._24_4_ = 0x7fffffff;
            auVar226._28_4_ = 0x7fffffff;
            _local_2860 = auVar245;
            local_2880 = local_26a0;
            auVar118 = vandps_avx(auVar226,auVar46);
            auVar15 = vandps_avx(auVar226,auVar48);
            auVar118 = vcmpps_avx(auVar118,auVar15,1);
            local_2680 = vblendvps_avx(auVar17,auVar16,auVar118);
            auVar50._4_4_ = fVar237 * fVar160;
            auVar50._0_4_ = fVar234 * fVar153;
            auVar50._8_4_ = fVar238 * fVar162;
            auVar50._12_4_ = fVar239 * fVar164;
            auVar50._16_4_ = fVar240 * fVar166;
            auVar50._20_4_ = fVar241 * fVar168;
            auVar50._24_4_ = fVar242 * fVar171;
            auVar50._28_4_ = auVar118._28_4_;
            auVar51._4_4_ = fVar237 * fVar114;
            auVar51._0_4_ = fVar234 * fVar113;
            auVar51._8_4_ = fVar238 * fVar115;
            auVar51._12_4_ = fVar239 * fVar97;
            auVar51._16_4_ = fVar240 * fVar98;
            auVar51._20_4_ = fVar241 * fVar99;
            auVar51._24_4_ = fVar242 * fVar100;
            auVar51._28_4_ = auVar16._28_4_;
            auVar52._4_4_ = fVar218 * fVar161;
            auVar52._0_4_ = fVar215 * fVar159;
            auVar52._8_4_ = fVar219 * fVar163;
            auVar52._12_4_ = fVar220 * fVar165;
            auVar52._16_4_ = fVar221 * fVar167;
            auVar52._20_4_ = fVar222 * fVar169;
            auVar52._24_4_ = fVar223 * fVar179;
            auVar52._28_4_ = auVar15._28_4_;
            auVar16 = vsubps_avx(auVar51,auVar52);
            auVar53._4_4_ = fVar161 * fVar207;
            auVar53._0_4_ = fVar159 * fVar203;
            auVar53._8_4_ = fVar163 * fVar123;
            auVar53._12_4_ = fVar165 * fVar136;
            auVar53._16_4_ = fVar167 * fVar137;
            auVar53._20_4_ = fVar169 * fVar138;
            auVar53._24_4_ = fVar179 * fVar139;
            auVar53._28_4_ = uStack_2804;
            auVar17 = vsubps_avx(auVar53,auVar50);
            auVar118 = vandps_avx(auVar226,auVar52);
            auVar15 = vandps_avx(auVar226,auVar50);
            auVar15 = vcmpps_avx(auVar118,auVar15,1);
            local_2660 = vblendvps_avx(auVar17,auVar16,auVar15);
            auVar54._4_4_ = fVar185 * fVar207;
            auVar54._0_4_ = fVar180 * fVar203;
            auVar54._8_4_ = fVar188 * fVar123;
            auVar54._12_4_ = fVar191 * fVar136;
            auVar54._16_4_ = fVar194 * fVar137;
            auVar54._20_4_ = fVar197 * fVar138;
            auVar54._24_4_ = fVar200 * fVar139;
            auVar54._28_4_ = auVar15._28_4_;
            auVar55._4_4_ = fVar218 * fVar185;
            auVar55._0_4_ = fVar215 * fVar180;
            auVar55._8_4_ = fVar219 * fVar188;
            auVar55._12_4_ = fVar220 * fVar191;
            auVar55._16_4_ = fVar221 * fVar194;
            auVar55._20_4_ = fVar222 * fVar197;
            auVar55._24_4_ = fVar223 * fVar200;
            auVar55._28_4_ = auVar16._28_4_;
            auVar56._4_4_ = fVar228 * fVar237;
            auVar56._0_4_ = fVar224 * fVar234;
            auVar56._8_4_ = fVar229 * fVar238;
            auVar56._12_4_ = fVar230 * fVar239;
            auVar56._16_4_ = fVar231 * fVar240;
            auVar56._20_4_ = fVar232 * fVar241;
            auVar56._24_4_ = fVar233 * fVar242;
            auVar56._28_4_ = auVar118._28_4_;
            auVar57._4_4_ = fVar237 * fVar186;
            auVar57._0_4_ = fVar234 * fVar181;
            auVar57._8_4_ = fVar238 * fVar189;
            auVar57._12_4_ = fVar239 * fVar192;
            auVar57._16_4_ = fVar240 * fVar195;
            auVar57._20_4_ = fVar241 * fVar198;
            auVar57._24_4_ = fVar242 * fVar201;
            auVar57._28_4_ = uStack_27c4;
            auVar16 = vsubps_avx(auVar55,auVar56);
            auVar17 = vsubps_avx(auVar57,auVar54);
            auVar118 = vandps_avx(auVar56,auVar226);
            auVar15 = vandps_avx(auVar54,auVar226);
            auVar118 = vcmpps_avx(auVar118,auVar15,1);
            local_2640 = vblendvps_avx(auVar17,auVar16,auVar118);
            auVar158 = ZEXT3264(local_2640);
            auVar125 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
            fVar97 = local_2640._0_4_;
            fVar165 = local_2640._4_4_;
            fVar98 = local_2640._8_4_;
            fVar167 = local_2640._12_4_;
            fVar99 = local_2640._16_4_;
            fVar169 = local_2640._20_4_;
            fVar100 = local_2640._24_4_;
            fVar179 = local_2660._0_4_;
            fVar184 = local_2660._4_4_;
            fVar187 = local_2660._8_4_;
            fVar190 = local_2660._12_4_;
            fVar193 = local_2660._16_4_;
            fVar196 = local_2660._20_4_;
            fVar199 = local_2660._24_4_;
            fVar202 = local_2680._0_4_;
            fVar206 = local_2680._4_4_;
            fVar208 = local_2680._8_4_;
            fVar209 = local_2680._12_4_;
            fVar210 = local_2680._16_4_;
            fVar211 = local_2680._20_4_;
            fVar212 = local_2680._24_4_;
            fVar102 = fVar202 * (float)local_29c0._4_4_ +
                      fVar179 * (float)local_2a20._4_4_ + fVar97 * local_2a00._4_4_;
            fVar152 = fVar206 * (float)local_29c0._4_4_ +
                      fVar184 * (float)local_2a20._4_4_ + fVar165 * local_2a00._4_4_;
            fVar113 = fVar208 * (float)local_29c0._4_4_ +
                      fVar187 * (float)local_2a20._4_4_ + fVar98 * local_2a00._4_4_;
            fVar159 = fVar209 * (float)local_29c0._4_4_ +
                      fVar190 * (float)local_2a20._4_4_ + fVar167 * local_2a00._4_4_;
            fVar114 = fVar210 * (float)local_29c0._4_4_ +
                      fVar193 * (float)local_2a20._4_4_ + fVar99 * local_2a00._4_4_;
            fVar161 = fVar211 * (float)local_29c0._4_4_ +
                      fVar196 * (float)local_2a20._4_4_ + fVar169 * local_2a00._4_4_;
            fVar115 = fVar212 * (float)local_29c0._4_4_ +
                      fVar199 * (float)local_2a20._4_4_ + fVar100 * local_2a00._4_4_;
            fVar163 = auVar118._28_4_ + auVar118._28_4_ + auVar105._28_4_;
            auVar108._0_4_ = fVar102 + fVar102;
            auVar108._4_4_ = fVar152 + fVar152;
            auVar108._8_4_ = fVar113 + fVar113;
            auVar108._12_4_ = fVar159 + fVar159;
            auVar108._16_4_ = fVar114 + fVar114;
            auVar108._20_4_ = fVar161 + fVar161;
            auVar108._24_4_ = fVar115 + fVar115;
            auVar108._28_4_ = fVar163 + fVar163;
            auVar118 = vrcpps_avx(auVar108);
            fVar102 = fVar202 * fVar243 + fVar179 * fVar3 + fVar97 * fVar253;
            fVar152 = fVar206 * fVar247 + fVar184 * fVar12 + fVar165 * fVar255;
            fVar113 = fVar208 * fVar248 + fVar187 * fVar13 + fVar98 * fVar256;
            fVar159 = fVar209 * fVar249 + fVar190 * fVar14 + fVar167 * fVar257;
            fVar114 = fVar210 * fVar250 + fVar193 * fVar101 + fVar99 * fVar258;
            fVar161 = fVar211 * fVar251 + fVar196 * fVar111 + fVar169 * fVar259;
            fVar115 = fVar212 * fVar252 + fVar199 * fVar112 + fVar100 * fVar260;
            fVar3 = auVar118._0_4_;
            fVar12 = auVar118._4_4_;
            auVar58._4_4_ = auVar108._4_4_ * fVar12;
            auVar58._0_4_ = auVar108._0_4_ * fVar3;
            fVar13 = auVar118._8_4_;
            auVar58._8_4_ = auVar108._8_4_ * fVar13;
            fVar14 = auVar118._12_4_;
            auVar58._12_4_ = auVar108._12_4_ * fVar14;
            fVar101 = auVar118._16_4_;
            auVar58._16_4_ = auVar108._16_4_ * fVar101;
            fVar111 = auVar118._20_4_;
            auVar58._20_4_ = auVar108._20_4_ * fVar111;
            fVar112 = auVar118._24_4_;
            auVar58._24_4_ = auVar108._24_4_ * fVar112;
            auVar58._28_4_ = auVar16._28_4_;
            auVar173._8_4_ = 0x3f800000;
            auVar173._0_8_ = 0x3f8000003f800000;
            auVar173._12_4_ = 0x3f800000;
            auVar173._16_4_ = 0x3f800000;
            auVar173._20_4_ = 0x3f800000;
            auVar173._24_4_ = 0x3f800000;
            auVar173._28_4_ = 0x3f800000;
            auVar118 = vsubps_avx(auVar173,auVar58);
            uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar150._4_4_ = uVar4;
            auVar150._0_4_ = uVar4;
            auVar150._8_4_ = uVar4;
            auVar150._12_4_ = uVar4;
            auVar150._16_4_ = uVar4;
            auVar150._20_4_ = uVar4;
            auVar150._24_4_ = uVar4;
            auVar150._28_4_ = uVar4;
            auVar151 = ZEXT3264(auVar150);
            local_25c0._4_4_ = (fVar152 + fVar152) * (fVar12 + fVar12 * auVar118._4_4_);
            local_25c0._0_4_ = (fVar102 + fVar102) * (fVar3 + fVar3 * auVar118._0_4_);
            local_25c0._8_4_ = (fVar113 + fVar113) * (fVar13 + fVar13 * auVar118._8_4_);
            local_25c0._12_4_ = (fVar159 + fVar159) * (fVar14 + fVar14 * auVar118._12_4_);
            local_25c0._16_4_ = (fVar114 + fVar114) * (fVar101 + fVar101 * auVar118._16_4_);
            local_25c0._20_4_ = (fVar161 + fVar161) * (fVar111 + fVar111 * auVar118._20_4_);
            local_25c0._24_4_ = (fVar115 + fVar115) * (fVar112 + fVar112 * auVar118._24_4_);
            local_25c0._28_4_ = auVar19._28_4_;
            auVar96 = ZEXT3264(local_25c0);
            auVar118 = vcmpps_avx(auVar150,local_25c0,2);
            fVar3 = (ray->super_RayK<1>).tfar;
            auVar132._4_4_ = fVar3;
            auVar132._0_4_ = fVar3;
            auVar132._8_4_ = fVar3;
            auVar132._12_4_ = fVar3;
            auVar132._16_4_ = fVar3;
            auVar132._20_4_ = fVar3;
            auVar132._24_4_ = fVar3;
            auVar132._28_4_ = fVar3;
            auVar146 = vcmpps_avx(local_25c0,auVar132,2);
            auVar135 = ZEXT3264(auVar146);
            auVar118 = vandps_avx(auVar146,auVar118);
            auVar15 = vcmpps_avx(auVar108,_DAT_01f7b000,4);
            auVar118 = vandps_avx(auVar118,auVar15);
            auVar127 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
            auVar125 = vpand_avx(auVar127,auVar125);
            auVar127 = vpmovsxwd_avx(auVar125);
            auVar103 = vpshufd_avx(auVar125,0xee);
            auVar103 = vpmovsxwd_avx(auVar103);
            local_2620._16_16_ = auVar103;
            local_2620._0_16_ = auVar127;
            if ((((((((local_2620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_2620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_2620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_2620 >> 0x7f,0) != '\0') ||
                  (local_2620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar103 >> 0x3f,0) != '\0') ||
                (local_2620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar103[0xf] < '\0') {
              local_26e0._4_4_ = fStack_29dc;
              local_26e0._0_4_ = local_29e0;
              fStack_26d8 = fStack_29d8;
              fStack_26d4 = fStack_29d4;
              fStack_26d0 = fStack_29d0;
              fStack_26cc = fStack_29cc;
              fStack_26c8 = fStack_29c8;
              fStack_26c4 = fStack_29c4;
              local_26c0 = auVar245._0_4_;
              fStack_26bc = auVar245._4_4_;
              fStack_26b8 = auVar245._8_4_;
              fStack_26b4 = auVar245._12_4_;
              fStack_26b0 = auVar245._16_4_;
              fStack_26ac = auVar245._20_4_;
              fStack_26a8 = auVar245._24_4_;
              fStack_26a4 = auVar245._28_4_;
              auVar118 = vrcpps_avx(local_26a0);
              fVar3 = auVar118._0_4_;
              fVar12 = auVar118._4_4_;
              auVar59._4_4_ = local_26a0._4_4_ * fVar12;
              auVar59._0_4_ = local_26a0._0_4_ * fVar3;
              fVar13 = auVar118._8_4_;
              auVar59._8_4_ = local_26a0._8_4_ * fVar13;
              fVar14 = auVar118._12_4_;
              auVar59._12_4_ = local_26a0._12_4_ * fVar14;
              fVar101 = auVar118._16_4_;
              auVar59._16_4_ = local_26a0._16_4_ * fVar101;
              fVar111 = auVar118._20_4_;
              auVar59._20_4_ = local_26a0._20_4_ * fVar111;
              fVar112 = auVar118._24_4_;
              auVar59._24_4_ = local_26a0._24_4_ * fVar112;
              auVar59._28_4_ = auVar146._28_4_;
              auVar177._8_4_ = 0x3f800000;
              auVar177._0_8_ = 0x3f8000003f800000;
              auVar177._12_4_ = 0x3f800000;
              auVar177._16_4_ = 0x3f800000;
              auVar177._20_4_ = 0x3f800000;
              auVar177._24_4_ = 0x3f800000;
              auVar177._28_4_ = 0x3f800000;
              auVar146 = vsubps_avx(auVar177,auVar59);
              auVar121._0_4_ = fVar3 + fVar3 * auVar146._0_4_;
              auVar121._4_4_ = fVar12 + fVar12 * auVar146._4_4_;
              auVar121._8_4_ = fVar13 + fVar13 * auVar146._8_4_;
              auVar121._12_4_ = fVar14 + fVar14 * auVar146._12_4_;
              auVar121._16_4_ = fVar101 + fVar101 * auVar146._16_4_;
              auVar121._20_4_ = fVar111 + fVar111 * auVar146._20_4_;
              auVar121._24_4_ = fVar112 + fVar112 * auVar146._24_4_;
              auVar121._28_4_ = auVar118._28_4_ + auVar146._28_4_;
              auVar133._8_4_ = 0x219392ef;
              auVar133._0_8_ = 0x219392ef219392ef;
              auVar133._12_4_ = 0x219392ef;
              auVar133._16_4_ = 0x219392ef;
              auVar133._20_4_ = 0x219392ef;
              auVar133._24_4_ = 0x219392ef;
              auVar133._28_4_ = 0x219392ef;
              auVar146 = vcmpps_avx(_local_2840,auVar133,5);
              auVar118 = vandps_avx(auVar146,auVar121);
              local_2540 = local_2500;
              auVar60._4_4_ = fStack_29dc * auVar118._4_4_;
              auVar60._0_4_ = local_29e0 * auVar118._0_4_;
              auVar60._8_4_ = fStack_29d8 * auVar118._8_4_;
              auVar60._12_4_ = fStack_29d4 * auVar118._12_4_;
              auVar60._16_4_ = fStack_29d0 * auVar118._16_4_;
              auVar60._20_4_ = fStack_29cc * auVar118._20_4_;
              auVar60._24_4_ = fStack_29c8 * auVar118._24_4_;
              auVar60._28_4_ = auVar146._28_4_;
              auVar146 = vminps_avx(auVar60,auVar177);
              auVar61._4_4_ = auVar245._4_4_ * auVar118._4_4_;
              auVar61._0_4_ = auVar245._0_4_ * auVar118._0_4_;
              auVar61._8_4_ = auVar245._8_4_ * auVar118._8_4_;
              auVar61._12_4_ = auVar245._12_4_ * auVar118._12_4_;
              auVar61._16_4_ = auVar245._16_4_ * auVar118._16_4_;
              auVar61._20_4_ = auVar245._20_4_ * auVar118._20_4_;
              auVar61._24_4_ = auVar245._24_4_ * auVar118._24_4_;
              auVar61._28_4_ = auVar118._28_4_;
              auVar118 = vminps_avx(auVar61,auVar177);
              auVar15 = vsubps_avx(auVar177,auVar146);
              local_25e0 = vblendvps_avx(auVar118,auVar15,local_2500);
              auVar118 = vsubps_avx(auVar177,auVar118);
              local_2600 = vblendvps_avx(auVar146,auVar118,local_2500);
              local_25a0[0] = fVar202 * (float)local_2520._0_4_;
              local_25a0[1] = fVar206 * (float)local_2520._4_4_;
              local_25a0[2] = fVar208 * fStack_2518;
              local_25a0[3] = fVar209 * fStack_2514;
              fStack_2590 = fVar210 * fStack_2510;
              fStack_258c = fVar211 * fStack_250c;
              fStack_2588 = fVar212 * fStack_2508;
              uStack_2584 = local_2600._28_4_;
              local_2580[0] = fVar179 * (float)local_2520._0_4_;
              local_2580[1] = fVar184 * (float)local_2520._4_4_;
              local_2580[2] = fVar187 * fStack_2518;
              local_2580[3] = fVar190 * fStack_2514;
              fStack_2570 = fVar193 * fStack_2510;
              fStack_256c = fVar196 * fStack_250c;
              fStack_2568 = fVar199 * fStack_2508;
              uStack_2564 = auVar146._28_4_;
              local_2560[0] = (float)local_2520._0_4_ * fVar97;
              local_2560[1] = (float)local_2520._4_4_ * fVar165;
              local_2560[2] = fStack_2518 * fVar98;
              local_2560[3] = fStack_2514 * fVar167;
              fStack_2550 = fStack_2510 * fVar99;
              fStack_254c = fStack_250c * fVar169;
              fStack_2548 = fStack_2508 * fVar100;
              uStack_2544 = uStack_2504;
              auVar127 = vpmovzxwd_avx(auVar125);
              auVar122._0_16_ = vpslld_avx(auVar127,0x1f);
              auVar127 = vpunpckhwd_avx(auVar125,auVar125);
              auVar127 = vpslld_avx(auVar127,0x1f);
              auVar122._16_16_ = auVar127;
              auVar134._8_4_ = 0x7f800000;
              auVar134._0_8_ = 0x7f8000007f800000;
              auVar134._12_4_ = 0x7f800000;
              auVar134._16_4_ = 0x7f800000;
              auVar134._20_4_ = 0x7f800000;
              auVar134._24_4_ = 0x7f800000;
              auVar134._28_4_ = 0x7f800000;
              auVar118 = vblendvps_avx(auVar134,local_25c0,auVar122);
              auVar146 = vshufps_avx(auVar118,auVar118,0xb1);
              auVar146 = vminps_avx(auVar118,auVar146);
              auVar15 = vshufpd_avx(auVar146,auVar146,5);
              auVar146 = vminps_avx(auVar146,auVar15);
              auVar15 = vperm2f128_avx(auVar146,auVar146,1);
              auVar146 = vminps_avx(auVar146,auVar15);
              auVar118 = vcmpps_avx(auVar118,auVar146,0);
              auVar135 = ZEXT1664(auVar118._16_16_);
              auVar127 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
              auVar125 = vpand_avx(auVar127,auVar125);
              auVar127 = vpmovzxwd_avx(auVar125);
              auVar127 = vpslld_avx(auVar127,0x1f);
              auVar127 = vpsrad_avx(auVar127,0x1f);
              auVar125 = vpunpckhwd_avx(auVar125,auVar125);
              auVar125 = vpslld_avx(auVar125,0x1f);
              auVar125 = vpsrad_avx(auVar125,0x1f);
              auVar94._16_16_ = auVar125;
              auVar94._0_16_ = auVar127;
              auVar118 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
              auVar151 = ZEXT3264(auVar118);
              local_28c0 = local_2620;
              if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar94 >> 0x7f,0) == '\0') &&
                    (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar125 >> 0x3f,0) == '\0') &&
                  (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar125[0xf]) {
                auVar94 = local_2620;
              }
              uVar79 = vextractps_avx(auVar118._0_16_,1);
              uVar72 = vmovmskps_avx(auVar94);
              local_29e0 = 0.0;
              _local_29a0 = auVar63;
              _local_2990 = auVar64;
              _local_2820 = auVar129;
              _local_27e0 = auVar147;
              _local_2740 = auVar65;
              _local_2730 = auVar66;
              _local_2720 = auVar67;
              _local_2710 = auVar68;
              if (uVar72 != 0) {
                for (; (uVar72 >> (int)local_29e0 & 1) == 0;
                    local_29e0 = (float)((int)local_29e0 + 1)) {
                }
              }
LAB_00e7039e:
              uVar78 = (ulong)(uint)local_29e0;
              local_28f8 = *(uint *)((long)&local_23c0 + uVar78 * 4);
              pGVar9 = (pSVar7->geometries).items[local_28f8].ptr;
              if ((pGVar9->mask & uVar79) == 0) {
                *(undefined4 *)(local_28c0 + uVar78 * 4) = 0;
              }
              else {
                pRVar91 = context->args;
                _local_2a20 = auVar151._0_32_;
                if (pRVar91->filter == (RTCFilterFunctionN)0x0) {
                  local_2940.context = context->user;
                  if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar3 = *(float *)(local_2600 + uVar78 * 4);
                    fVar12 = *(float *)(local_25e0 + uVar78 * 4);
                    (ray->super_RayK<1>).tfar = local_25a0[uVar78 - 8];
                    (ray->Ng).field_0.field_0.x = local_25a0[uVar78];
                    (ray->Ng).field_0.field_0.y = local_2580[uVar78];
                    (ray->Ng).field_0.field_0.z = local_2560[uVar78];
                    ray->u = fVar3;
                    ray->v = fVar12;
                    ray->primID = *(uint *)((long)&local_2700 + uVar78 * 4);
                    ray->geomID = local_28f8;
                    ray->instID[0] = (local_2940.context)->instID[0];
                    ray->instPrimID[0] = (local_2940.context)->instPrimID[0];
                    goto LAB_00e706e9;
                  }
                }
                else {
                  local_2940.context = context->user;
                }
                local_290c = local_2580[uVar78];
                auVar135 = ZEXT464((uint)local_290c);
                local_2910 = local_25a0[uVar78];
                local_2908 = local_2560[uVar78];
                local_2904 = *(undefined4 *)(local_2600 + uVar78 * 4);
                local_2900 = *(undefined4 *)(local_25e0 + uVar78 * 4);
                local_28fc = *(undefined4 *)((long)&local_2700 + uVar78 * 4);
                local_28f4 = (local_2940.context)->instID[0];
                local_28f0 = (local_2940.context)->instPrimID[0];
                (ray->super_RayK<1>).tfar = local_25a0[uVar78 - 8];
                local_2a24 = -1;
                local_2940.valid = &local_2a24;
                local_2940.geometryUserPtr = pGVar9->userPtr;
                local_2940.ray = (RTCRayN *)ray;
                local_2940.hit = (RTCHitN *)&local_2910;
                local_2940.N = 1;
                local_28e0._0_8_ = pGVar9;
                _local_29c0 = auVar96._0_32_;
                fStack_29dc = 0.0;
                if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e70586:
                  if ((pRVar91->filter != (RTCFilterFunctionN)0x0) &&
                     (((pRVar91->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_28e0._0_8_ + 0x3e) & 0x40) != 0)))) {
                    auVar135 = ZEXT1664(auVar135._0_16_);
                    auVar158 = ZEXT1664(auVar158._0_16_);
                    (*pRVar91->filter)(&local_2940);
                    uVar78 = CONCAT44(fStack_29dc,local_29e0);
                    auVar96 = ZEXT3264(_local_29c0);
                    if (*local_2940.valid == 0) goto LAB_00e70633;
                  }
                  (((Vec3f *)((long)local_2940.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_2940.hit;
                  (((Vec3f *)((long)local_2940.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_2940.hit + 4);
                  (((Vec3f *)((long)local_2940.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_2940.hit + 8);
                  *(float *)((long)local_2940.ray + 0x3c) = *(float *)(local_2940.hit + 0xc);
                  *(float *)((long)local_2940.ray + 0x40) = *(float *)(local_2940.hit + 0x10);
                  *(float *)((long)local_2940.ray + 0x44) = *(float *)(local_2940.hit + 0x14);
                  *(float *)((long)local_2940.ray + 0x48) = *(float *)(local_2940.hit + 0x18);
                  *(float *)((long)local_2940.ray + 0x4c) = *(float *)(local_2940.hit + 0x1c);
                  *(float *)((long)local_2940.ray + 0x50) = *(float *)(local_2940.hit + 0x20);
                }
                else {
                  local_2a00 = pRVar91;
                  auVar135 = ZEXT464((uint)local_290c);
                  auVar158 = ZEXT1664(auVar158._0_16_);
                  (*pGVar9->intersectionFilterN)(&local_2940);
                  uVar78 = CONCAT44(fStack_29dc,local_29e0);
                  auVar96 = ZEXT3264(_local_29c0);
                  pRVar91 = local_2a00;
                  if (*local_2940.valid != 0) goto LAB_00e70586;
LAB_00e70633:
                  (ray->super_RayK<1>).tfar = (float)local_2a20._0_4_;
                }
                *(undefined4 *)(local_28c0 + uVar78 * 4) = 0;
                fVar3 = (ray->super_RayK<1>).tfar;
                auVar95._4_4_ = fVar3;
                auVar95._0_4_ = fVar3;
                auVar95._8_4_ = fVar3;
                auVar95._12_4_ = fVar3;
                auVar95._16_4_ = fVar3;
                auVar95._20_4_ = fVar3;
                auVar95._24_4_ = fVar3;
                auVar95._28_4_ = fVar3;
                auVar118 = vcmpps_avx(auVar96._0_32_,auVar95,2);
                local_28c0 = vandps_avx(auVar118,local_28c0);
                uVar79 = (ray->super_RayK<1>).mask;
                auVar151 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
              }
              if ((((((((local_28c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_28c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_28c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_28c0 >> 0x7f,0) == '\0') &&
                    (local_28c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_28c0 >> 0xbf,0) == '\0') &&
                  (local_28c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_28c0[0x1f]) goto LAB_00e706e9;
              auVar109._8_4_ = 0x7f800000;
              auVar109._0_8_ = 0x7f8000007f800000;
              auVar109._12_4_ = 0x7f800000;
              auVar109._16_4_ = 0x7f800000;
              auVar109._20_4_ = 0x7f800000;
              auVar109._24_4_ = 0x7f800000;
              auVar109._28_4_ = 0x7f800000;
              auVar118 = vblendvps_avx(auVar109,auVar96._0_32_,local_28c0);
              auVar146 = vshufps_avx(auVar118,auVar118,0xb1);
              auVar146 = vminps_avx(auVar118,auVar146);
              auVar15 = vshufpd_avx(auVar146,auVar146,5);
              auVar146 = vminps_avx(auVar146,auVar15);
              auVar15 = vperm2f128_avx(auVar146,auVar146,1);
              auVar135 = ZEXT3264(auVar15);
              auVar146 = vminps_avx(auVar146,auVar15);
              auVar146 = vcmpps_avx(auVar118,auVar146,0);
              auVar15 = local_28c0 & auVar146;
              auVar118 = local_28c0;
              if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar15 >> 0x7f,0) != '\0') ||
                    (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar15 >> 0xbf,0) != '\0') ||
                  (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar15[0x1f] < '\0') {
                auVar118 = vandps_avx(auVar146,local_28c0);
              }
              uVar72 = vmovmskps_avx(auVar118);
              local_29e0 = 0.0;
              if (uVar72 != 0) {
                for (; (uVar72 >> (int)local_29e0 & 1) == 0;
                    local_29e0 = (float)((int)local_29e0 + 1)) {
                }
              }
              goto LAB_00e7039e;
            }
          }
LAB_00e706e9:
          auVar183 = ZEXT3264(local_23e0);
          auVar205 = ZEXT3264(local_2400);
          auVar214 = ZEXT3264(local_2420);
          auVar217 = ZEXT3264(local_2440);
          auVar227 = ZEXT3264(local_2460);
          auVar236 = ZEXT3264(local_2480);
          auVar246 = ZEXT3264(local_24a0);
          auVar254 = ZEXT3264(local_24c0);
          auVar178 = ZEXT3264(local_24e0);
          auVar174 = ZEXT3264(local_28a0);
          uVar78 = local_2980;
        }
        fVar3 = (ray->super_RayK<1>).tfar;
        auVar96 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412
                                                  (fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))))
        ;
        auVar110 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      }
      goto LAB_00e6f451;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }